

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json-validator.cpp
# Opt level: O1

shared_ptr<(anonymous_namespace)::schema> __thiscall
anon_unknown.dwarf_68875::type_schema::make
          (type_schema *this,json *schema,value_t type,root_schema *root,
          vector<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_> *uris,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *kw)

{
  _Manager_type *this_00;
  _Invoker_type p_Var1;
  value_t vVar2;
  pointer pcVar3;
  size_type sVar4;
  pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>
  *__a;
  pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>
  *ppVar5;
  element_type *this_01;
  _Base_ptr this_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>
  *__args;
  undefined8 uVar7;
  format_checker *pfVar8;
  json_value jVar9;
  undefined8 uVar10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var11;
  pointer pjVar12;
  _func_int **pp_Var13;
  char cVar14;
  bool bVar15;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp_1;
  root_schema *prVar16;
  reference pbVar17;
  reference pbVar18;
  json_value jVar19;
  string_type *psVar20;
  string_type *psVar21;
  _Link_type p_Var22;
  uchar *puVar23;
  ulong uVar24;
  allocator_type *paVar25;
  undefined8 *puVar26;
  invalid_argument *piVar27;
  root_schema *prVar28;
  undefined7 in_register_00000011;
  undefined **ppuVar29;
  pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>
  *__args_00;
  pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>
  *extraout_RDX;
  pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>
  *ppVar30;
  pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>
  *extraout_RDX_00;
  pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>
  *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var31;
  ulong uVar32;
  char cVar33;
  _Link_type p_Var34;
  long lVar35;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  ulong uVar36;
  allocator_type *__a_00;
  _Rb_tree_node_base *p_Var37;
  long *plVar38;
  pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*> pVar39;
  shared_ptr<(anonymous_namespace)::schema> sVar40;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_02;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_03;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_04;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_05;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_06;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_07;
  const_iterator attr;
  long ret;
  iterator __begin4;
  iterator __end4;
  size_type __dnew_4;
  size_type __dnew;
  json_value local_388;
  json_value jStack_380;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_378;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_368;
  long local_358 [8];
  json_value local_318;
  json_value jStack_310;
  json_value jStack_308;
  undefined2 uStack_300;
  undefined1 uStack_2fe;
  undefined1 uStack_2fd;
  undefined1 uStack_2fc;
  undefined1 uStack_2fb;
  undefined2 uStack_2fa;
  json_value local_2a8;
  json_value jStack_2a0;
  undefined7 uStack_298;
  undefined1 uStack_291;
  undefined7 uStack_290;
  undefined1 uStack_289;
  root_schema *local_280;
  root_schema *local_278;
  root_schema *local_270;
  format_checker *local_268;
  string *local_260;
  json_value local_258;
  json_value jStack_250;
  pointer pbStack_248;
  long *plStack_240;
  type_schema *local_238;
  allocator_type local_229;
  json_value local_228;
  json_value jStack_220;
  json_value local_218;
  long *plStack_210;
  undefined1 local_208 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f8;
  undefined1 local_1e8 [24];
  json_value local_1d0;
  json_value local_1c8;
  undefined8 uStack_1c0;
  undefined8 uStack_1b8;
  vector<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_> local_1b0;
  json_value local_198;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_190;
  pointer pbStack_188;
  undefined8 uStack_180;
  _Rb_tree_node_base *local_178 [2];
  _Rb_tree_node_base local_168 [2];
  json_value local_120;
  json_value local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_100;
  long local_f0 [2];
  json_value local_e0;
  json_value local_d8;
  ulong uStack_d0;
  undefined8 local_c8;
  _func_int **local_c0;
  pointer pjStack_b8;
  iteration_proxy<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  local_b0;
  schema local_a8;
  schema local_88;
  json_value local_68;
  json_value local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  vector<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_> local_48;
  
  local_388 = (json_value)schema;
  local_278 = root;
  local_260 = (string *)uris;
  local_238 = this;
  switch(CONCAT71(in_register_00000011,type) & 0xffffffff) {
  case 0:
    local_270 = (root_schema *)operator_new(0x30);
    *(undefined8 *)((long)&(local_270->loader_).super__Function_base._M_functor + 8) = 0x100000001;
    *(undefined ***)&(local_270->loader_).super__Function_base._M_functor =
         &PTR___Sp_counted_ptr_inplace_0015a240;
    (local_270->loader_)._M_invoker = (_Invoker_type)local_278;
    (local_270->format_check_).super__Function_base._M_functor._M_pod_data[0] = '\0';
    *(undefined8 *)((long)&(local_270->format_check_).super__Function_base._M_functor + 8) = 0;
    ppuVar29 = &PTR_make_for_default__0015a290;
    goto LAB_0011e381;
  case 1:
    prVar16 = (root_schema *)operator_new(0x100);
    *(undefined8 *)((long)&(prVar16->loader_).super__Function_base._M_functor + 8) = 0x100000001;
    *(undefined ***)&(prVar16->loader_).super__Function_base._M_functor =
         &PTR___Sp_counted_ptr_inplace_0015a560;
    (prVar16->loader_)._M_invoker = (_Invoker_type)local_278;
    (prVar16->format_check_).super__Function_base._M_functor._M_pod_data[0] = '\0';
    *(undefined8 *)((long)&(prVar16->format_check_).super__Function_base._M_functor + 8) = 0;
    (prVar16->loader_).super__Function_base._M_manager =
         (_Manager_type)&PTR_make_for_default__0015a5b0;
    *(undefined1 *)&(prVar16->format_check_).super__Function_base._M_manager = 0;
    (prVar16->format_check_)._M_invoker = (_Invoker_type)0x0;
    (prVar16->content_check_).super__Function_base._M_functor._M_pod_data[0] = '\0';
    *(undefined4 *)&(prVar16->files_)._M_t._M_impl = 0;
    *(undefined8 *)&(prVar16->files_)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
    *(undefined8 *)((long)&(prVar16->content_check_).super__Function_base._M_functor + 8) = 0;
    (prVar16->content_check_).super__Function_base._M_manager = (_Manager_type)0x0;
    (prVar16->content_check_)._M_invoker = (_Invoker_type)0x0;
    (prVar16->root_).super___shared_ptr<(anonymous_namespace)::schema,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
    (prVar16->files_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)&prVar16->files_;
    (prVar16->files_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         (_Base_ptr)&prVar16->files_;
    local_270 = (root_schema *)&(prVar16->files_)._M_t._M_impl.super__Rb_tree_header._M_node_count;
    p_Var1 = (_Invoker_type)((long)&prVar16[1].format_check_.super__Function_base._M_functor + 8);
    *(undefined4 *)((long)&prVar16[1].format_check_.super__Function_base._M_functor + 8) = 0;
    prVar16[1].format_check_.super__Function_base._M_manager = (_Manager_type)0x0;
    (prVar16->files_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
    (prVar16->files_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    *(undefined8 *)&prVar16[1].loader_.super__Function_base._M_functor = 0;
    *(undefined8 *)((long)&prVar16[1].loader_.super__Function_base._M_functor + 8) = 0;
    prVar16[1].loader_.super__Function_base._M_manager = (_Manager_type)0x0;
    prVar16[1].loader_._M_invoker = (_Invoker_type)0x0;
    prVar16[1].format_check_._M_invoker = p_Var1;
    *(_Invoker_type *)&prVar16[1].content_check_.super__Function_base._M_functor = p_Var1;
    *(undefined8 *)((long)&prVar16[1].content_check_.super__Function_base._M_functor + 8) = 0;
    prVar16[1].content_check_.super__Function_base._M_manager = (_Manager_type)0x0;
    prVar16[1].content_check_._M_invoker = (_Invoker_type)0x0;
    local_280 = prVar16;
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::find<const_char_(&)[14],_0>((iterator *)&local_2a8,schema,(char (*) [14])"maxProperties");
    local_378._8_8_ = 0x8000000000000000;
    local_378._M_allocated_capacity = 0;
    jStack_380.object = (object_t *)0x0;
    if (schema->m_type == array) {
      local_378._M_allocated_capacity =
           (size_type)
           (((schema->m_value).array)->
           super__Vector_base<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
    }
    else if (schema->m_type == object) {
      jStack_380.object =
           (object_t *)&(((schema->m_value).object)->_M_t)._M_impl.super__Rb_tree_header;
    }
    else {
      local_378._8_8_ = 1;
    }
    bVar15 = nlohmann::json_abi_v3_11_2::detail::
             iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ::
             operator==<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                       ((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         *)&local_2a8,
                        (iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         *)&local_388);
    if (!bVar15) {
      pbVar18 = nlohmann::json_abi_v3_11_2::detail::
                iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::operator*((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                             *)&local_2a8);
      local_388.object = (object_t *)0x0;
      nlohmann::json_abi_v3_11_2::detail::
      get_arithmetic_value<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_unsigned_long,_0>
                (pbVar18,&local_388.number_unsigned);
      *(undefined1 *)&(local_280->format_check_).super__Function_base._M_manager = 1;
      (local_280->format_check_)._M_invoker = (_Invoker_type)local_388;
      local_258 = local_2a8;
      jStack_250 = jStack_2a0;
      nlohmann::json_abi_v3_11_2::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::
      erase<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_0>
                ((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)&local_388,schema,
                 (iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)&local_258);
    }
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::find<const_char_(&)[14],_0>((iterator *)&local_388,schema,(char (*) [14])"minProperties");
    uStack_298 = (undefined7)local_378._M_allocated_capacity;
    uStack_291 = (undefined1)((ulong)local_378._0_8_ >> 0x38);
    uStack_290 = (undefined7)local_378._8_8_;
    uStack_289 = (undefined1)((ulong)local_378._8_8_ >> 0x38);
    local_2a8.string = local_388.string;
    jStack_2a0.string = jStack_380.string;
    local_378._8_8_ = 0x8000000000000000;
    local_378._M_allocated_capacity = 0;
    jStack_380.object = (object_t *)0x0;
    if (schema->m_type == array) {
      local_378._M_allocated_capacity =
           (size_type)
           (((schema->m_value).array)->
           super__Vector_base<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
    }
    else if (schema->m_type == object) {
      jStack_380.object =
           (object_t *)&(((schema->m_value).object)->_M_t)._M_impl.super__Rb_tree_header;
    }
    else {
      local_378._8_8_ = 1;
    }
    local_388 = (json_value)schema;
    bVar15 = nlohmann::json_abi_v3_11_2::detail::
             iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ::
             operator==<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                       ((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         *)&local_2a8,
                        (iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         *)&local_388);
    if (!bVar15) {
      pbVar18 = nlohmann::json_abi_v3_11_2::detail::
                iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::operator*((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                             *)&local_2a8);
      local_388.object = (object_t *)0x0;
      nlohmann::json_abi_v3_11_2::detail::
      get_arithmetic_value<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_unsigned_long,_0>
                (pbVar18,&local_388.number_unsigned);
      (local_280->content_check_).super__Function_base._M_functor._M_pod_data[0] = '\x01';
      ((json_value *)((long)&(local_280->content_check_).super__Function_base._M_functor + 8))->
      object = (object_t *)local_388;
      local_228 = local_2a8;
      local_218.number_integer._7_1_ = uStack_291;
      local_218.number_integer._0_7_ = uStack_298;
      jStack_220 = jStack_2a0;
      plStack_210 = (long *)CONCAT17(uStack_289,uStack_290);
      nlohmann::json_abi_v3_11_2::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::
      erase<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_0>
                ((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)&local_388,schema,
                 (iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)&local_228);
    }
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::find<const_char_(&)[9],_0>((iterator *)&local_388,schema,(char (*) [9])"required");
    uStack_298 = (undefined7)local_378._M_allocated_capacity;
    uStack_291 = (undefined1)((ulong)local_378._0_8_ >> 0x38);
    uStack_290 = (undefined7)local_378._8_8_;
    uStack_289 = (undefined1)((ulong)local_378._8_8_ >> 0x38);
    local_2a8.string = local_388.string;
    jStack_2a0.string = jStack_380.string;
    local_378._8_8_ = 0x8000000000000000;
    local_378._M_allocated_capacity = 0;
    jStack_380.object = (object_t *)0x0;
    if (schema->m_type == array) {
      local_378._M_allocated_capacity =
           (size_type)
           (((schema->m_value).array)->
           super__Vector_base<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
    }
    else if (schema->m_type == object) {
      jStack_380.object =
           (object_t *)&(((schema->m_value).object)->_M_t)._M_impl.super__Rb_tree_header;
    }
    else {
      local_378._8_8_ = 1;
    }
    local_388 = (json_value)schema;
    bVar15 = nlohmann::json_abi_v3_11_2::detail::
             iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ::
             operator==<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                       ((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         *)&local_2a8,
                        (iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         *)&local_388);
    if (!bVar15) {
      pbVar18 = nlohmann::json_abi_v3_11_2::detail::
                iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::operator*((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                             *)&local_2a8);
      nlohmann::json_abi_v3_11_2::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::
      get_impl<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_0>
                (&local_318,pbVar18);
      local_388 = (json_value)(local_280->content_check_).super__Function_base._M_manager;
      jStack_380 = (json_value)(local_280->content_check_)._M_invoker;
      local_378._M_allocated_capacity =
           (size_type)
           (local_280->root_).
           super___shared_ptr<(anonymous_namespace)::schema,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      (local_280->content_check_).super__Function_base._M_manager = (_Manager_type)local_318;
      (local_280->content_check_)._M_invoker = (_Invoker_type)jStack_310;
      (local_280->root_).
      super___shared_ptr<(anonymous_namespace)::schema,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)
           CONCAT17(jStack_308.number_integer._7_1_,
                    CONCAT25(jStack_308.number_integer._5_2_,
                             CONCAT14(jStack_308.number_integer._4_1_,
                                      jStack_308.number_integer._0_4_)));
      local_318.object = (object_t *)0x0;
      jStack_310 = (json_value)0x0;
      jStack_308.number_integer._0_4_ = 0;
      jStack_308.number_integer._4_1_ = 0;
      jStack_308.number_integer._5_2_ = 0;
      jStack_308.number_integer._7_1_ = 0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_388);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_318);
      local_68 = local_2a8;
      uStack_58 = CONCAT17(uStack_291,uStack_298);
      local_60 = jStack_2a0;
      local_50 = CONCAT17(uStack_289,uStack_290);
      nlohmann::json_abi_v3_11_2::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::
      erase<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_0>
                ((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)&local_388,schema,
                 (iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)&local_68);
    }
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::find<const_char_(&)[11],_0>((iterator *)&local_388,schema,(char (*) [11])0x14519e);
    uStack_298 = (undefined7)local_378._M_allocated_capacity;
    uStack_291 = (undefined1)((ulong)local_378._0_8_ >> 0x38);
    uStack_290 = (undefined7)local_378._8_8_;
    uStack_289 = (undefined1)((ulong)local_378._8_8_ >> 0x38);
    local_2a8.string = local_388.string;
    jStack_2a0.string = jStack_380.string;
    local_378._8_8_ = -0x8000000000000000;
    local_378._M_allocated_capacity = 0;
    jStack_380.object = (object_t *)0x0;
    if (schema->m_type == array) {
      local_378._M_allocated_capacity =
           (size_type)
           (((schema->m_value).array)->
           super__Vector_base<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
    }
    else if (schema->m_type == object) {
      jStack_380.object =
           (object_t *)&(((schema->m_value).object)->_M_t)._M_impl.super__Rb_tree_header;
    }
    else {
      local_378._8_8_ = 1;
    }
    local_388 = (json_value)schema;
    bVar15 = nlohmann::json_abi_v3_11_2::detail::
             iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ::
             operator==<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                       ((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         *)&local_2a8,
                        (iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         *)&local_388);
    if (!bVar15) {
      local_1b0.super__Vector_base<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)nlohmann::json_abi_v3_11_2::detail::
                    iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    ::operator*((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                 *)&local_2a8);
      local_268 = (format_checker *)
                  &(prVar16->root_).
                   super___shared_ptr<(anonymous_namespace)::schema,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount;
      nlohmann::json_abi_v3_11_2::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::begin((iterator *)&local_318,
              (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               *)local_1b0.
                 super__Vector_base<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_>._M_impl
                 .super__Vector_impl_data._M_start);
      nlohmann::json_abi_v3_11_2::detail::
      iteration_proxy_value<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
      ::iteration_proxy_value
                ((iteration_proxy_value<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                  *)&local_388,
                 (iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)&local_318,0);
      nlohmann::json_abi_v3_11_2::detail::
      iteration_proxy<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
      ::end((iteration_proxy_value<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
             *)&local_318,
            (iteration_proxy<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
             *)&local_1b0);
      while (bVar15 = nlohmann::json_abi_v3_11_2::detail::
                      iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                      ::
                      operator==<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                                ((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                  *)&local_388,
                                 (iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                  *)&local_318), !bVar15) {
        nlohmann::json_abi_v3_11_2::detail::
        iteration_proxy_value<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
        ::iteration_proxy_value
                  ((iteration_proxy_value<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                    *)&local_198,
                   (iteration_proxy_value<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                    *)&local_388);
        psVar20 = nlohmann::json_abi_v3_11_2::detail::
                  iteration_proxy_value<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                  ::key((iteration_proxy_value<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                         *)&local_198);
        pbVar18 = nlohmann::json_abi_v3_11_2::detail::
                  iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  ::operator*((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                               *)&local_198);
        local_120.object = (object_t *)&uStack_110;
        uStack_110 = 0x69747265706f7270;
        local_118.number_integer = 10;
        local_108 = CONCAT53(local_108._3_5_,0x7365);
        psVar21 = nlohmann::json_abi_v3_11_2::detail::
                  iteration_proxy_value<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                  ::key((iteration_proxy_value<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                         *)&local_198);
        local_100._M_allocated_capacity = (size_type)local_f0;
        pcVar3 = (psVar21->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_100,pcVar3,pcVar3 + psVar21->_M_string_length);
        __l._M_len = 2;
        __l._M_array = (iterator)&local_120;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)(local_1e8 + 0x18),__l,(allocator_type *)&local_48);
        std::vector<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_>::vector
                  ((vector<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_> *)&local_88,
                   (vector<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_> *)local_260);
        anon_unknown.dwarf_68875::schema::make
                  ((schema *)local_208,pbVar18,local_278,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)(local_1e8 + 0x18),
                   (vector<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_> *)&local_88);
        pcVar3 = (psVar20->_M_dataplus)._M_p;
        local_e0.object = (object_t *)&uStack_d0;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_e0,pcVar3,pcVar3 + psVar20->_M_string_length);
        local_c0 = (_func_int **)local_208._0_8_;
        pjStack_b8 = (pointer)local_208._8_8_;
        local_208._0_8_ = (_func_int **)0x0;
        local_208._8_8_ = (pointer)0x0;
        p_Var22 = (_Link_type)operator_new(0x50);
        pjVar12 = pjStack_b8;
        pfVar8 = local_268;
        p_Var34 = (_Link_type)&p_Var22->_M_storage;
        puVar23 = (p_Var22->_M_storage)._M_storage + 0x10;
        *(uchar **)(p_Var22->_M_storage)._M_storage = puVar23;
        if (local_e0.object == (object_t *)&uStack_d0) {
          *(ulong *)puVar23 = uStack_d0;
          *(undefined8 *)((p_Var22->_M_storage)._M_storage + 0x18) = local_c8;
        }
        else {
          *(json_value *)
           ((__aligned_membuf<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>_>
             *)p_Var34)->_M_storage = local_e0;
          *(ulong *)puVar23 = uStack_d0;
        }
        *(json_value *)((p_Var22->_M_storage)._M_storage + 8) = local_d8;
        local_d8.object = (object_t *)0x0;
        uStack_d0 = uStack_d0 & 0xffffffffffffff00;
        (p_Var22->_M_storage)._M_storage[0x28] = '\0';
        (p_Var22->_M_storage)._M_storage[0x29] = '\0';
        (p_Var22->_M_storage)._M_storage[0x2a] = '\0';
        (p_Var22->_M_storage)._M_storage[0x2b] = '\0';
        (p_Var22->_M_storage)._M_storage[0x2c] = '\0';
        (p_Var22->_M_storage)._M_storage[0x2d] = '\0';
        (p_Var22->_M_storage)._M_storage[0x2e] = '\0';
        (p_Var22->_M_storage)._M_storage[0x2f] = '\0';
        pjStack_b8 = (pointer)0x0;
        *(_func_int ***)((p_Var22->_M_storage)._M_storage + 0x20) = local_c0;
        *(pointer *)((p_Var22->_M_storage)._M_storage + 0x28) = pjVar12;
        local_c0 = (_func_int **)0x0;
        local_e0.object = (object_t *)&uStack_d0;
        pVar39 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>_>_>
                 ::_M_get_insert_unique_pos
                           ((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>_>_>
                             *)local_268,(key_type *)p_Var34);
        if (pVar39.second == (_Base_ptr)0x0) {
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>_>_>
          ::_M_drop_node((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>_>_>
                          *)p_Var22,p_Var34);
        }
        else {
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>_>_>
          ::_M_insert_node((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>_>_>
                            *)pfVar8,pVar39.first,pVar39.second,p_Var22);
        }
        if (pjStack_b8 != (pointer)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pjStack_b8);
        }
        if (local_e0.object != (object_t *)&uStack_d0) {
          operator_delete(local_e0.object,uStack_d0 + 1);
        }
        if ((pointer)local_208._8_8_ != (pointer)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_208._8_8_);
        }
        std::vector<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_>::~vector
                  ((vector<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_> *)&local_88);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(local_1e8 + 0x18));
        lVar35 = -0x40;
        plVar38 = local_f0;
        do {
          if (plVar38 != (long *)plVar38[-2]) {
            operator_delete((long *)plVar38[-2],*plVar38 + 1);
          }
          plVar38 = plVar38 + -4;
          lVar35 = lVar35 + 0x20;
        } while (lVar35 != 0);
        nlohmann::json_abi_v3_11_2::detail::
        iteration_proxy_value<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
        ::~iteration_proxy_value
                  ((iteration_proxy_value<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                    *)&local_198);
        vVar2 = *(value_t *)&((local_388.object)->_M_t)._M_impl;
        if (vVar2 == array) {
          local_378._M_allocated_capacity = local_378._M_allocated_capacity + 0x10;
        }
        else if (vVar2 == object) {
          jStack_380.string = (string_t *)std::_Rb_tree_increment(jStack_380.string);
        }
        else {
          local_378._8_8_ = local_378._8_8_ + 1;
        }
        local_368._M_allocated_capacity = local_368._M_allocated_capacity + 1;
      }
      nlohmann::json_abi_v3_11_2::detail::
      iteration_proxy_value<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
      ::~iteration_proxy_value
                ((iteration_proxy_value<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                  *)&local_318);
      nlohmann::json_abi_v3_11_2::detail::
      iteration_proxy_value<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
      ::~iteration_proxy_value
                ((iteration_proxy_value<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                  *)&local_388);
      local_e0 = local_2a8;
      uStack_d0 = CONCAT17(uStack_291,uStack_298);
      local_d8 = jStack_2a0;
      local_c8 = CONCAT17(uStack_289,uStack_290);
      nlohmann::json_abi_v3_11_2::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::
      erase<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_0>
                ((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)&local_388,schema,
                 (iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)&local_e0);
    }
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::find<const_char_(&)[18],_0>((iterator *)&local_388,schema,(char (*) [18])"patternProperties");
    uStack_298 = (undefined7)local_378._M_allocated_capacity;
    uStack_291 = (undefined1)((ulong)local_378._0_8_ >> 0x38);
    uStack_290 = (undefined7)local_378._8_8_;
    uStack_289 = (undefined1)((ulong)local_378._8_8_ >> 0x38);
    local_2a8.string = local_388.string;
    jStack_2a0.string = jStack_380.string;
    local_378._8_8_ = -0x8000000000000000;
    local_378._M_allocated_capacity = 0;
    jStack_380.object = (object_t *)0x0;
    if (schema->m_type == array) {
      local_378._M_allocated_capacity =
           (size_type)
           (((schema->m_value).array)->
           super__Vector_base<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
    }
    else if (schema->m_type == object) {
      jStack_380.object =
           (object_t *)&(((schema->m_value).object)->_M_t)._M_impl.super__Rb_tree_header;
    }
    else {
      local_378._8_8_ = 1;
    }
    local_388 = (json_value)schema;
    bVar15 = nlohmann::json_abi_v3_11_2::detail::
             iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ::
             operator==<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                       ((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         *)&local_2a8,
                        (iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         *)&local_388);
    if (!bVar15) {
      local_1e8._0_8_ =
           nlohmann::json_abi_v3_11_2::detail::
           iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
           ::operator*((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                        *)&local_2a8);
      nlohmann::json_abi_v3_11_2::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::begin((iterator *)&local_318,
              (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               *)local_1e8._0_8_);
      nlohmann::json_abi_v3_11_2::detail::
      iteration_proxy_value<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
      ::iteration_proxy_value
                ((iteration_proxy_value<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                  *)&local_388,
                 (iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)&local_318,0);
      nlohmann::json_abi_v3_11_2::detail::
      iteration_proxy<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
      ::end((iteration_proxy_value<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
             *)&local_318,
            (iteration_proxy<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
             *)local_1e8);
      local_268 = (format_checker *)0x7fffffffffffffe0;
      while( true ) {
        bVar15 = nlohmann::json_abi_v3_11_2::detail::
                 iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 ::
                 operator==<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                           ((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                             *)&local_388,
                            (iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                             *)&local_318);
        if (bVar15) break;
        nlohmann::json_abi_v3_11_2::detail::
        iteration_proxy_value<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
        ::iteration_proxy_value
                  ((iteration_proxy_value<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                    *)&local_198,
                   (iteration_proxy_value<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                    *)&local_388);
        psVar20 = nlohmann::json_abi_v3_11_2::detail::
                  iteration_proxy_value<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                  ::key((iteration_proxy_value<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                         *)&local_198);
        std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>::
        basic_regex<std::char_traits<char>,std::allocator<char>>
                  ((basic_regex<char,std::__cxx11::regex_traits<char>> *)(local_1e8 + 0x18),psVar20,
                   0x10);
        pbVar18 = nlohmann::json_abi_v3_11_2::detail::
                  iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  ::operator*((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                               *)&local_198);
        psVar20 = nlohmann::json_abi_v3_11_2::detail::
                  iteration_proxy_value<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                  ::key((iteration_proxy_value<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                         *)&local_198);
        pcVar3 = (psVar20->_M_dataplus)._M_p;
        local_208._0_8_ = local_208 + 0x10;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_208,pcVar3,pcVar3 + psVar20->_M_string_length);
        __l_00._M_len = 1;
        __l_00._M_array = (iterator)local_208;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_1b0,__l_00,(allocator_type *)&local_b0);
        std::vector<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_>::vector
                  (&local_48,
                   (vector<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_> *)local_260);
        anon_unknown.dwarf_68875::schema::make
                  (&local_a8,pbVar18,local_278,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_1b0,&local_48);
        local_120.number_integer._0_4_ = local_1d0.number_integer._0_4_;
        std::locale::locale((locale *)&local_118.boolean,(locale *)&local_1c8.boolean);
        prVar28 = local_280;
        uStack_110 = uStack_1c0;
        local_108 = uStack_1b8;
        uStack_1c0 = 0;
        uStack_1b8 = 0;
        local_100._M_allocated_capacity = (size_type)local_a8._vptr_schema;
        local_100._8_8_ = local_a8.root_;
        local_a8._vptr_schema = (_func_int **)0x0;
        local_a8.root_ = (root_schema *)0x0;
        __a = *(pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>
                **)&local_280[1].loader_.super__Function_base._M_functor;
        if (__a == *(pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>
                     **)((long)&local_280[1].loader_.super__Function_base._M_functor + 8)) {
          ppVar5 = *(pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>
                     **)local_270;
          if ((format_checker *)((long)__a - (long)ppVar5) == local_268) {
            std::__throw_length_error("vector::_M_realloc_insert");
          }
          lVar35 = (long)((long)__a - (long)ppVar5) >> 4;
          uVar36 = lVar35 * -0x5555555555555555;
          uVar24 = uVar36;
          if (__a == ppVar5) {
            uVar24 = 1;
          }
          uVar32 = uVar24 + uVar36;
          if (0x2aaaaaaaaaaaaa9 < uVar32) {
            uVar32 = 0x2aaaaaaaaaaaaaa;
          }
          if (CARRY8(uVar24,uVar36)) {
            uVar32 = 0x2aaaaaaaaaaaaaa;
          }
          if (uVar32 == 0) {
            paVar25 = (allocator_type *)0x0;
            ppVar30 = __args_00;
          }
          else {
            paVar25 = (allocator_type *)operator_new(uVar32 * 0x30);
            ppVar30 = extraout_RDX;
          }
          std::
          allocator_traits<std::allocator<std::pair<std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>,std::shared_ptr<(anonymous_namespace)::schema>>>>
          ::
          construct<std::pair<std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>,std::shared_ptr<(anonymous_namespace)::schema>>,std::pair<std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>,std::shared_ptr<(anonymous_namespace)::schema>>>
                    (paVar25 + lVar35 * 0x10,
                     (pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>
                      *)&local_120,ppVar30);
          __args = extraout_RDX_00;
          __a_00 = paVar25;
          prVar28 = local_280;
          for (ppVar30 = ppVar5; local_280 = prVar28, __a != ppVar30; ppVar30 = ppVar30 + 1) {
            std::
            allocator_traits<std::allocator<std::pair<std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>,std::shared_ptr<(anonymous_namespace)::schema>>>>
            ::
            construct<std::pair<std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>,std::shared_ptr<(anonymous_namespace)::schema>>,std::pair<std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>,std::shared_ptr<(anonymous_namespace)::schema>>>
                      (__a_00,ppVar30,__args);
            p_Var6 = (ppVar30->second).
                     super___shared_ptr<(anonymous_namespace)::schema,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi;
            if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
            }
            std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
                      (&ppVar30->first);
            __a_00 = __a_00 + 0x30;
            __args = extraout_RDX_01;
            prVar28 = local_280;
          }
          if (ppVar5 != (pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>
                         *)0x0) {
            operator_delete(ppVar5,*(long *)((long)&prVar28[1].loader_.super__Function_base.
                                                    _M_functor + 8) - (long)ppVar5);
          }
          (prVar28->files_)._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)paVar25;
          *(allocator_type **)&prVar28[1].loader_.super__Function_base._M_functor = __a_00 + 0x30;
          *(allocator_type **)((long)&prVar28[1].loader_.super__Function_base._M_functor + 8) =
               paVar25 + uVar32 * 0x30;
        }
        else {
          std::
          allocator_traits<std::allocator<std::pair<std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>,std::shared_ptr<(anonymous_namespace)::schema>>>>
          ::
          construct<std::pair<std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>,std::shared_ptr<(anonymous_namespace)::schema>>,std::pair<std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>,std::shared_ptr<(anonymous_namespace)::schema>>>
                    ((allocator_type *)__a,
                     (pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>
                      *)&local_120,__args_00);
          *(long *)&prVar28[1].loader_.super__Function_base._M_functor =
               *(long *)&prVar28[1].loader_.super__Function_base._M_functor + 0x30;
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_100._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_100._8_8_);
        }
        std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
                  ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&local_120);
        if (local_a8.root_ != (root_schema *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8.root_);
        }
        std::vector<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_>::~vector(&local_48);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_1b0);
        if ((undefined1 *)local_208._0_8_ != local_208 + 0x10) {
          operator_delete((void *)local_208._0_8_,local_1f8._M_allocated_capacity + 1);
        }
        std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
                  ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)(local_1e8 + 0x18));
        nlohmann::json_abi_v3_11_2::detail::
        iteration_proxy_value<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
        ::~iteration_proxy_value
                  ((iteration_proxy_value<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                    *)&local_198);
        vVar2 = *(value_t *)&((local_388.object)->_M_t)._M_impl;
        if (vVar2 == array) {
          local_378._M_allocated_capacity = local_378._M_allocated_capacity + 0x10;
        }
        else if (vVar2 == object) {
          jStack_380.string = (string_t *)std::_Rb_tree_increment(jStack_380.string);
        }
        else {
          local_378._8_8_ = local_378._8_8_ + 1;
        }
        local_368._M_allocated_capacity = local_368._M_allocated_capacity + 1;
      }
      nlohmann::json_abi_v3_11_2::detail::
      iteration_proxy_value<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
      ::~iteration_proxy_value
                ((iteration_proxy_value<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                  *)&local_318);
      nlohmann::json_abi_v3_11_2::detail::
      iteration_proxy_value<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
      ::~iteration_proxy_value
                ((iteration_proxy_value<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                  *)&local_388);
      local_120 = local_2a8;
      uStack_110 = CONCAT17(uStack_291,uStack_298);
      local_118 = jStack_2a0;
      local_108 = CONCAT17(uStack_289,uStack_290);
      nlohmann::json_abi_v3_11_2::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::
      erase<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_0>
                ((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)&local_388,schema,
                 (iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)&local_120);
    }
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::find<const_char_(&)[21],_0>
              ((iterator *)&local_388,schema,(char (*) [21])"additionalProperties");
    uStack_298 = (undefined7)local_378._M_allocated_capacity;
    uStack_291 = (undefined1)((ulong)local_378._0_8_ >> 0x38);
    uStack_290 = (undefined7)local_378._8_8_;
    uStack_289 = (undefined1)((ulong)local_378._8_8_ >> 0x38);
    local_2a8.string = local_388.string;
    jStack_2a0.string = jStack_380.string;
    local_378._8_8_ = 0x8000000000000000;
    local_378._M_allocated_capacity = 0;
    jStack_380.object = (object_t *)0x0;
    if (schema->m_type == array) {
      local_378._M_allocated_capacity =
           (size_type)
           (((schema->m_value).array)->
           super__Vector_base<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
    }
    else if (schema->m_type == object) {
      jStack_380.object =
           (object_t *)&(((schema->m_value).object)->_M_t)._M_impl.super__Rb_tree_header;
    }
    else {
      local_378._8_8_ = 1;
    }
    local_388 = (json_value)schema;
    bVar15 = nlohmann::json_abi_v3_11_2::detail::
             iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ::
             operator==<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                       ((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         *)&local_2a8,
                        (iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         *)&local_388);
    if (!bVar15) {
      pbVar18 = nlohmann::json_abi_v3_11_2::detail::
                iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::operator*((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                             *)&local_2a8);
      local_1d0.number_integer = 0x14;
      local_388.object = (object_t *)&local_378;
      local_388.object =
           (object_t *)
           std::__cxx11::string::_M_create(&local_388.number_unsigned,(ulong)(local_1e8 + 0x18));
      local_378._M_allocated_capacity = (size_type)local_1d0;
      ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)&(local_388.array)->
           super__Vector_base<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
      )->_M_allocated_capacity = 0x6e6f697469646461;
      *(char *)&(((_Vector_base<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                   *)local_388)->_M_impl).super__Vector_impl_data._M_finish = 'a';
      *(char *)((long)&(((_Vector_base<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                          *)local_388)->_M_impl).super__Vector_impl_data._M_finish + 1) = 'l';
      *(char *)((long)&(((_Vector_base<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                          *)local_388)->_M_impl).super__Vector_impl_data._M_finish + 2) = 'P';
      *(char *)((long)&(((_Vector_base<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                          *)local_388)->_M_impl).super__Vector_impl_data._M_finish + 3) = 'r';
      *(char *)((long)&(((_Vector_base<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                          *)local_388)->_M_impl).super__Vector_impl_data._M_finish + 4) = 'o';
      *(char *)((long)&(((_Vector_base<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                          *)local_388)->_M_impl).super__Vector_impl_data._M_finish + 5) = 'p';
      *(char *)((long)&(((_Vector_base<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                          *)local_388)->_M_impl).super__Vector_impl_data._M_finish + 6) = 'e';
      *(char *)((long)&(((_Vector_base<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                          *)local_388)->_M_impl).super__Vector_impl_data._M_finish + 7) = 'r';
      *(undefined4 *)
       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)&(local_388.object)->_M_t + 1) = 0x73656974;
      jStack_380.string = local_1d0.string;
      ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)&(local_388.object)->_M_t)->_M_local_buf[(long)local_1d0.object] = '\0';
      __l_01._M_len = 1;
      __l_01._M_array = (iterator)&local_388;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_318,__l_01,(allocator_type *)(local_1e8 + 0x18));
      std::vector<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_>::vector
                ((vector<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_> *)local_208,
                 (vector<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_> *)local_260);
      anon_unknown.dwarf_68875::schema::make
                ((schema *)&local_198,pbVar18,local_278,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_318,
                 (vector<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_> *)local_208);
      p_Var11 = p_Stack_190;
      jVar19 = local_198;
      local_198.object = (object_t *)0x0;
      p_Stack_190 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      p_Var6 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_280[1].loader_._M_invoker;
      local_280[1].loader_.super__Function_base._M_manager = (_Manager_type)jVar19;
      local_280[1].loader_._M_invoker = (_Invoker_type)p_Var11;
      if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
      }
      if (p_Stack_190 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_190);
      }
      std::vector<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_>::~vector
                ((vector<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_> *)local_208);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_318);
      if (local_388.object != (object_t *)&local_378) {
        operator_delete(local_388.object,(ulong)(local_378._M_allocated_capacity + 1));
      }
      local_1d0 = local_2a8;
      uStack_1c0 = CONCAT17(uStack_291,uStack_298);
      local_1c8 = jStack_2a0;
      uStack_1b8 = CONCAT17(uStack_289,uStack_290);
      nlohmann::json_abi_v3_11_2::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::
      erase<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_0>
                ((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)&local_388,schema,
                 (iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)(local_1e8 + 0x18));
    }
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::find<const_char_(&)[13],_0>((iterator *)&local_388,schema,(char (*) [13])"dependencies");
    uStack_298 = (undefined7)local_378._M_allocated_capacity;
    uStack_291 = (undefined1)((ulong)local_378._0_8_ >> 0x38);
    uStack_290 = (undefined7)local_378._8_8_;
    uStack_289 = (undefined1)((ulong)local_378._8_8_ >> 0x38);
    local_2a8.string = local_388.string;
    jStack_2a0.string = jStack_380.string;
    local_378._8_8_ = -0x8000000000000000;
    local_378._M_allocated_capacity = 0;
    jStack_380.object = (object_t *)0x0;
    if (schema->m_type == array) {
      local_378._M_allocated_capacity =
           (size_type)
           (((schema->m_value).array)->
           super__Vector_base<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
    }
    else if (schema->m_type == object) {
      jStack_380.object =
           (object_t *)&(((schema->m_value).object)->_M_t)._M_impl.super__Rb_tree_header;
    }
    else {
      local_378._8_8_ = 1;
    }
    local_388 = (json_value)schema;
    bVar15 = nlohmann::json_abi_v3_11_2::detail::
             iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ::
             operator==<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                       ((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         *)&local_2a8,
                        (iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         *)&local_388);
    if (!bVar15) {
      local_b0.container =
           nlohmann::json_abi_v3_11_2::detail::
           iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
           ::operator*((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                        *)&local_2a8);
      local_268 = &prVar16[1].format_check_;
      nlohmann::json_abi_v3_11_2::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::begin((iterator *)&local_318,local_b0.container);
      nlohmann::json_abi_v3_11_2::detail::
      iteration_proxy_value<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
      ::iteration_proxy_value
                ((iteration_proxy_value<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                  *)&local_388,
                 (iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)&local_318,0);
      nlohmann::json_abi_v3_11_2::detail::
      iteration_proxy<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
      ::end((iteration_proxy_value<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
             *)&local_318,&local_b0);
      while (bVar15 = nlohmann::json_abi_v3_11_2::detail::
                      iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                      ::
                      operator==<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                                ((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                  *)&local_388,
                                 (iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                  *)&local_318), !bVar15) {
        pbVar18 = nlohmann::json_abi_v3_11_2::detail::
                  iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  ::operator*((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                               *)&local_388);
        if (pbVar18->m_type == array) {
          psVar20 = nlohmann::json_abi_v3_11_2::detail::
                    iteration_proxy_value<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                    ::key((iteration_proxy_value<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                           *)&local_388);
          pbVar18 = nlohmann::json_abi_v3_11_2::detail::
                    iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    ::operator*((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                 *)&local_388);
          nlohmann::json_abi_v3_11_2::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::
          get_impl<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_0>
                    (&local_198,pbVar18);
          puVar26 = (undefined8 *)operator_new(0x48);
          puVar26[1] = 0x100000001;
          *puVar26 = &PTR___Sp_counted_ptr_inplace_0015a600;
          puVar26[3] = local_278;
          *(undefined1 *)(puVar26 + 4) = 0;
          puVar26[5] = 0;
          puVar26[2] = &PTR_make_for_default__0015a650;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)(puVar26 + 6),
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_198);
          p_Var22 = (_Link_type)operator_new(0x50);
          p_Var34 = (_Link_type)&p_Var22->_M_storage;
          *(uchar **)(p_Var22->_M_storage)._M_storage = (p_Var22->_M_storage)._M_storage + 0x10;
          pcVar3 = (psVar20->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)p_Var34,pcVar3,pcVar3 + psVar20->_M_string_length);
          pfVar8 = local_268;
          *(undefined8 **)((p_Var22->_M_storage)._M_storage + 0x20) = puVar26 + 2;
          *(undefined8 **)((p_Var22->_M_storage)._M_storage + 0x28) = puVar26;
          pVar39 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>_>_>
                   ::_M_get_insert_unique_pos
                             ((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>_>_>
                               *)local_268,(key_type *)p_Var34);
          if (pVar39.second == (_Base_ptr)0x0) {
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>_>_>
            ::_M_drop_node((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>_>_>
                            *)p_Var22,p_Var34);
          }
          else {
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>_>_>
            ::_M_insert_node((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>_>_>
                              *)pfVar8,pVar39.first,pVar39.second,p_Var22);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_198);
        }
        else {
          psVar20 = nlohmann::json_abi_v3_11_2::detail::
                    iteration_proxy_value<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                    ::key((iteration_proxy_value<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                           *)&local_388);
          pbVar18 = nlohmann::json_abi_v3_11_2::detail::
                    iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    ::operator*((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                 *)&local_388);
          local_198.object = (object_t *)&pbStack_188;
          pbStack_188 = (pointer)0x6e65646e65706564;
          p_Stack_190 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xc;
          uStack_180 = CONCAT35(uStack_180._5_3_,0x73656963);
          psVar21 = nlohmann::json_abi_v3_11_2::detail::
                    iteration_proxy_value<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                    ::key((iteration_proxy_value<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                           *)&local_388);
          local_178[0] = local_168;
          pcVar3 = (psVar21->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_178,pcVar3,pcVar3 + psVar21->_M_string_length);
          __l_02._M_len = 2;
          __l_02._M_array = (iterator)&local_198;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_1b0,__l_02,&local_229);
          std::vector<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_>::vector
                    ((vector<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_> *)&local_a8,
                     (vector<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_> *)local_260);
          anon_unknown.dwarf_68875::schema::make
                    ((schema *)local_1e8,pbVar18,local_278,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_1b0,
                     (vector<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_> *)&local_a8);
          p_Var22 = (_Link_type)operator_new(0x50);
          p_Var34 = (_Link_type)&p_Var22->_M_storage;
          *(uchar **)(p_Var22->_M_storage)._M_storage = (p_Var22->_M_storage)._M_storage + 0x10;
          pcVar3 = (psVar20->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)p_Var34,pcVar3,pcVar3 + psVar20->_M_string_length);
          uVar7 = local_1e8._8_8_;
          pfVar8 = local_268;
          (p_Var22->_M_storage)._M_storage[0x28] = '\0';
          (p_Var22->_M_storage)._M_storage[0x29] = '\0';
          (p_Var22->_M_storage)._M_storage[0x2a] = '\0';
          (p_Var22->_M_storage)._M_storage[0x2b] = '\0';
          (p_Var22->_M_storage)._M_storage[0x2c] = '\0';
          (p_Var22->_M_storage)._M_storage[0x2d] = '\0';
          (p_Var22->_M_storage)._M_storage[0x2e] = '\0';
          (p_Var22->_M_storage)._M_storage[0x2f] = '\0';
          local_1e8._8_8_ = (root_schema *)0x0;
          *(undefined8 *)((p_Var22->_M_storage)._M_storage + 0x20) = local_1e8._0_8_;
          *(undefined8 *)((p_Var22->_M_storage)._M_storage + 0x28) = uVar7;
          local_1e8._0_8_ = (reference)0x0;
          pVar39 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>_>_>
                   ::_M_get_insert_unique_pos
                             ((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>_>_>
                               *)local_268,(key_type *)p_Var34);
          if (pVar39.second == (_Base_ptr)0x0) {
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>_>_>
            ::_M_drop_node((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>_>_>
                            *)p_Var22,p_Var34);
          }
          else {
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>_>_>
            ::_M_insert_node((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<(anonymous_namespace)::schema>_>_>_>
                              *)pfVar8,pVar39.first,pVar39.second,p_Var22);
          }
          if ((root_schema *)local_1e8._8_8_ != (root_schema *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1e8._8_8_);
          }
          std::vector<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_>::~vector
                    ((vector<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_> *)&local_a8);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_1b0);
          lVar35 = -0x40;
          p_Var37 = local_168;
          do {
            if (p_Var37 != p_Var37[-1]._M_left) {
              operator_delete(p_Var37[-1]._M_left,*(long *)p_Var37 + 1);
            }
            p_Var37 = p_Var37 + -1;
            lVar35 = lVar35 + 0x20;
          } while (lVar35 != 0);
        }
        if (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)&(local_388.object)->_M_t)->_M_local_buf[0] == '\x02') {
          local_378._M_allocated_capacity = local_378._M_allocated_capacity + 0x10;
        }
        else if (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)&(local_388.object)->_M_t)->_M_local_buf[0] == '\x01') {
          jStack_380.string = (string_t *)std::_Rb_tree_increment(jStack_380.string);
        }
        else {
          local_378._8_8_ = local_378._8_8_ + 1;
        }
        local_368._M_allocated_capacity = local_368._M_allocated_capacity + 1;
      }
      nlohmann::json_abi_v3_11_2::detail::
      iteration_proxy_value<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
      ::~iteration_proxy_value
                ((iteration_proxy_value<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                  *)&local_318);
      nlohmann::json_abi_v3_11_2::detail::
      iteration_proxy_value<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
      ::~iteration_proxy_value
                ((iteration_proxy_value<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                  *)&local_388);
      local_388 = local_2a8;
      local_378._M_allocated_capacity = CONCAT17(uStack_291,uStack_298);
      jStack_380 = jStack_2a0;
      local_378._8_8_ = CONCAT17(uStack_289,uStack_290);
      nlohmann::json_abi_v3_11_2::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::
      erase<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_0>
                ((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)&local_318,schema,
                 (iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)&local_388);
    }
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::find<const_char_(&)[14],_0>((iterator *)&local_318,schema,(char (*) [14])"propertyNames");
    uStack_298 = CONCAT25(jStack_308.number_integer._5_2_,
                          CONCAT14(jStack_308.number_integer._4_1_,jStack_308.number_integer._0_4_))
    ;
    uStack_291 = jStack_308.number_integer._7_1_;
    uStack_290 = (undefined7)
                 CONCAT26(uStack_2fa,
                          CONCAT15(uStack_2fb,
                                   CONCAT14(uStack_2fc,
                                            CONCAT13(uStack_2fd,CONCAT12(uStack_2fe,uStack_300)))));
    uStack_289 = (undefined1)((ushort)uStack_2fa >> 8);
    local_2a8 = local_318;
    jStack_2a0 = jStack_310;
    uStack_2fa = 0x8000;
    uStack_300 = 0;
    jStack_308.number_integer._7_1_ = 0;
    jStack_308.number_integer._5_2_ = 0;
    jStack_308.number_integer._4_1_ = 0;
    jStack_308.number_integer._0_4_ = 0;
    jStack_310 = (json_value)0x0;
    if (schema->m_type == array) {
      sVar4 = ((schema->m_value).string)->_M_string_length;
      jStack_308.number_integer._0_4_ = (undefined4)sVar4;
      jStack_308.number_integer._4_1_ = (undefined1)(sVar4 >> 0x20);
      jStack_308.number_integer._5_2_ = (undefined2)(sVar4 >> 0x28);
      jStack_308.number_integer._7_1_ = (undefined1)(sVar4 >> 0x38);
    }
    else if (schema->m_type == object) {
      jStack_310.object =
           (object_t *)&(((schema->m_value).object)->_M_t)._M_impl.super__Rb_tree_header;
    }
    else {
      uStack_300 = 1;
      uStack_2fa = 0;
    }
    uStack_2fb = 0;
    uStack_2fc = 0;
    uStack_2fd = 0;
    uStack_2fe = 0;
    local_318 = (json_value)schema;
    bVar15 = nlohmann::json_abi_v3_11_2::detail::
             iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ::
             operator==<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                       ((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         *)&local_2a8,
                        (iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         *)&local_318);
    if (!bVar15) {
      pbVar18 = nlohmann::json_abi_v3_11_2::detail::
                iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::operator*((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                             *)&local_2a8);
      jStack_308.number_integer._0_4_ = 0x706f7270;
      jStack_308.number_integer._4_1_ = 0x65;
      jStack_308.number_integer._5_2_ = 0x7472;
      jStack_308.number_integer._7_1_ = 0x79;
      uStack_300 = 0x614e;
      uStack_2fe = 0x6d;
      uStack_2fd = 0x65;
      uStack_2fc = 0x73;
      jStack_310 = (json_value)0xd;
      uStack_2fb = 0;
      __l_03._M_len = 1;
      __l_03._M_array = (iterator)&local_318;
      local_318.object = (object_t *)&jStack_308;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_198,__l_03,(allocator_type *)&local_b0);
      std::vector<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_>::vector
                (&local_1b0,
                 (vector<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_> *)local_260);
      anon_unknown.dwarf_68875::schema::make
                ((schema *)local_1e8,pbVar18,local_278,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_198,&local_1b0);
      uVar10 = local_1e8._8_8_;
      uVar7 = local_1e8._0_8_;
      local_1e8._0_8_ = (reference)0x0;
      local_1e8._8_8_ = (root_schema *)0x0;
      p_Var6 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_280[1].content_check_._M_invoker;
      local_280[1].content_check_.super__Function_base._M_manager = (_Manager_type)uVar7;
      local_280[1].content_check_._M_invoker = (_Invoker_type)uVar10;
      if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
      }
      if ((root_schema *)local_1e8._8_8_ != (root_schema *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1e8._8_8_);
      }
      std::vector<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_>::~vector(&local_1b0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_198);
      if (local_318.object != (object_t *)&jStack_308) {
        operator_delete(local_318.object,
                        CONCAT17(jStack_308.number_integer._7_1_,
                                 CONCAT25(jStack_308.number_integer._5_2_,
                                          CONCAT14(jStack_308.number_integer._4_1_,
                                                   jStack_308.number_integer._0_4_))) + 1);
      }
      local_318 = local_2a8;
      jStack_310 = jStack_2a0;
      jStack_308.number_integer._0_4_ = (undefined4)uStack_298;
      jStack_308.number_integer._4_1_ = (undefined1)((uint7)uStack_298 >> 0x20);
      jStack_308.number_integer._5_2_ = (undefined2)((uint7)uStack_298 >> 0x28);
      jStack_308.number_integer._7_1_ = uStack_291;
      uStack_300 = (undefined2)uStack_290;
      uStack_2fe = (undefined1)((uint7)uStack_290 >> 0x10);
      uStack_2fd = (undefined1)((uint7)uStack_290 >> 0x18);
      uStack_2fc = (undefined1)((uint7)uStack_290 >> 0x20);
      uStack_2fb = (undefined1)((uint7)uStack_290 >> 0x28);
      uStack_2fa = (undefined2)(CONCAT17(uStack_289,uStack_290) >> 0x30);
      nlohmann::json_abi_v3_11_2::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::
      erase<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_0>
                ((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)&local_198,schema,
                 (iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)&local_318);
    }
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::find<const_char_(&)[8],_0>((iterator *)&local_198,schema,(char (*) [8])"default");
    uStack_298 = SUB87(pbStack_188,0);
    uStack_291 = (undefined1)((ulong)pbStack_188 >> 0x38);
    uStack_290 = (undefined7)uStack_180;
    uStack_289 = (undefined1)((ulong)uStack_180 >> 0x38);
    local_2a8 = local_198;
    jStack_2a0 = (json_value)p_Stack_190;
    uStack_180 = 0x8000000000000000;
    pbStack_188 = (pointer)0x0;
    p_Stack_190 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if (schema->m_type == array) {
      pbStack_188 = (((schema->m_value).array)->
                    super__Vector_base<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish;
    }
    else if (schema->m_type == object) {
      p_Stack_190 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                    &(((schema->m_value).object)->_M_t)._M_impl.super__Rb_tree_header;
    }
    else {
      uStack_180 = 1;
    }
    local_198 = (json_value)schema;
    bVar15 = nlohmann::json_abi_v3_11_2::detail::
             iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ::
             operator==<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                       ((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         *)&local_2a8,
                        (iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         *)&local_198);
    this_00 = &(prVar16->loader_).super__Function_base._M_manager;
    if (!bVar15) {
      pbVar18 = nlohmann::json_abi_v3_11_2::detail::
                iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::operator*((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                             *)&local_2a8);
      anon_unknown.dwarf_68875::schema::set_default_value((schema *)this_00,pbVar18);
    }
    (local_238->super_schema)._vptr_schema = (_func_int **)this_00;
    local_270 = local_280;
    this = local_238;
    break;
  case 2:
    prVar16 = (root_schema *)operator_new(0xa0);
    *(undefined8 *)((long)&(prVar16->loader_).super__Function_base._M_functor + 8) = 0x100000001;
    *(undefined ***)&(prVar16->loader_).super__Function_base._M_functor =
         &PTR___Sp_counted_ptr_inplace_0015a6e0;
    (prVar16->loader_)._M_invoker = (_Invoker_type)local_278;
    (prVar16->format_check_).super__Function_base._M_functor._M_pod_data[0] = '\0';
    *(undefined8 *)((long)&(prVar16->format_check_).super__Function_base._M_functor + 8) = 0;
    (prVar16->loader_).super__Function_base._M_manager =
         (_Manager_type)&PTR_make_for_default__0015a730;
    *(undefined1 *)&(prVar16->format_check_).super__Function_base._M_manager = 0;
    (prVar16->format_check_)._M_invoker = (_Invoker_type)0x0;
    (prVar16->content_check_).super__Function_base._M_functor._M_pod_data[0] = '\0';
    *(undefined8 *)((long)&(prVar16->content_check_).super__Function_base._M_functor + 8) = 0;
    *(undefined1 *)&(prVar16->content_check_).super__Function_base._M_manager = 0;
    local_268 = (format_checker *)
                &(prVar16->root_).
                 super___shared_ptr<(anonymous_namespace)::schema,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount;
    (prVar16->content_check_)._M_invoker = (_Invoker_type)0x0;
    (prVar16->root_).super___shared_ptr<(anonymous_namespace)::schema,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
    (prVar16->root_).super___shared_ptr<(anonymous_namespace)::schema,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    *(undefined8 *)&(prVar16->files_)._M_t._M_impl = 0;
    *(undefined8 *)&(prVar16->files_)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
    (prVar16->files_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    (prVar16->files_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
    (prVar16->files_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
    (prVar16->files_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_270 = prVar16;
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::find<const_char_(&)[9],_0>((iterator *)&local_318,schema,(char (*) [9])"maxItems");
    local_378._8_8_ = 0x8000000000000000;
    local_378._M_allocated_capacity = 0;
    jStack_380.object = (object_t *)0x0;
    if (schema->m_type == array) {
      local_378._M_allocated_capacity =
           (size_type)
           (((schema->m_value).array)->
           super__Vector_base<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
    }
    else if (schema->m_type == object) {
      jStack_380.object =
           (object_t *)&(((schema->m_value).object)->_M_t)._M_impl.super__Rb_tree_header;
    }
    else {
      local_378._8_8_ = 1;
    }
    bVar15 = nlohmann::json_abi_v3_11_2::detail::
             iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ::
             operator==<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                       ((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         *)&local_318,
                        (iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         *)&local_388);
    if (!bVar15) {
      pbVar18 = nlohmann::json_abi_v3_11_2::detail::
                iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::operator*((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                             *)&local_318);
      local_388.object = (object_t *)0x0;
      nlohmann::json_abi_v3_11_2::detail::
      get_arithmetic_value<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_unsigned_long,_0>
                (pbVar18,&local_388.number_unsigned);
      *(undefined1 *)&(local_270->format_check_).super__Function_base._M_manager = 1;
      (local_270->format_check_)._M_invoker = (_Invoker_type)local_388;
      local_198 = local_318;
      p_Stack_190 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)jStack_310;
      nlohmann::json_abi_v3_11_2::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::
      erase<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_0>
                ((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)&local_388,schema,
                 (iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)&local_198);
    }
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::find<const_char_(&)[9],_0>((iterator *)&local_388,schema,(char (*) [9])"minItems");
    jStack_308.number_integer._0_4_ = (undefined4)local_378._M_allocated_capacity;
    jStack_308.number_integer._4_1_ = (undefined1)((ulong)local_378._0_8_ >> 0x20);
    jStack_308.number_integer._5_2_ = (undefined2)((ulong)local_378._0_8_ >> 0x28);
    jStack_308.number_integer._7_1_ = (undefined1)((ulong)local_378._0_8_ >> 0x38);
    uStack_300 = (undefined2)local_378._8_8_;
    uStack_2fe = (undefined1)((ulong)local_378._8_8_ >> 0x10);
    uStack_2fd = (undefined1)((ulong)local_378._8_8_ >> 0x18);
    uStack_2fc = (undefined1)((ulong)local_378._8_8_ >> 0x20);
    uStack_2fb = (undefined1)((ulong)local_378._8_8_ >> 0x28);
    uStack_2fa = (undefined2)((ulong)local_378._8_8_ >> 0x30);
    local_318.string = local_388.string;
    jStack_310.string = jStack_380.string;
    local_378._8_8_ = 0x8000000000000000;
    local_378._M_allocated_capacity = 0;
    jStack_380.object = (object_t *)0x0;
    if (schema->m_type == array) {
      local_378._M_allocated_capacity =
           (size_type)
           (((schema->m_value).array)->
           super__Vector_base<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
    }
    else if (schema->m_type == object) {
      jStack_380.object =
           (object_t *)&(((schema->m_value).object)->_M_t)._M_impl.super__Rb_tree_header;
    }
    else {
      local_378._8_8_ = 1;
    }
    local_388 = (json_value)schema;
    bVar15 = nlohmann::json_abi_v3_11_2::detail::
             iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ::
             operator==<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                       ((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         *)&local_318,
                        (iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         *)&local_388);
    if (!bVar15) {
      pbVar18 = nlohmann::json_abi_v3_11_2::detail::
                iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::operator*((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                             *)&local_318);
      local_388.object = (object_t *)0x0;
      nlohmann::json_abi_v3_11_2::detail::
      get_arithmetic_value<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_unsigned_long,_0>
                (pbVar18,&local_388.number_unsigned);
      (local_270->content_check_).super__Function_base._M_functor._M_pod_data[0] = '\x01';
      ((json_value *)((long)&(local_270->content_check_).super__Function_base._M_functor + 8))->
      object = (object_t *)local_388;
      local_120 = local_318;
      uStack_110 = CONCAT17(jStack_308.number_integer._7_1_,
                            CONCAT25(jStack_308.number_integer._5_2_,
                                     CONCAT14(jStack_308.number_integer._4_1_,
                                              jStack_308.number_integer._0_4_)));
      local_118 = jStack_310;
      local_108 = CONCAT26(uStack_2fa,
                           CONCAT15(uStack_2fb,
                                    CONCAT14(uStack_2fc,
                                             CONCAT13(uStack_2fd,CONCAT12(uStack_2fe,uStack_300)))))
      ;
      nlohmann::json_abi_v3_11_2::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::
      erase<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_0>
                ((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)&local_388,schema,
                 (iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)&local_120);
    }
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::find<const_char_(&)[12],_0>((iterator *)&local_388,schema,(char (*) [12])"uniqueItems");
    jStack_308.number_integer._0_4_ = (undefined4)local_378._M_allocated_capacity;
    jStack_308.number_integer._4_1_ = (undefined1)((ulong)local_378._0_8_ >> 0x20);
    jStack_308.number_integer._5_2_ = (undefined2)((ulong)local_378._0_8_ >> 0x28);
    jStack_308.number_integer._7_1_ = (undefined1)((ulong)local_378._0_8_ >> 0x38);
    uStack_300 = (undefined2)local_378._8_8_;
    uStack_2fe = (undefined1)((ulong)local_378._8_8_ >> 0x10);
    uStack_2fd = (undefined1)((ulong)local_378._8_8_ >> 0x18);
    uStack_2fc = (undefined1)((ulong)local_378._8_8_ >> 0x20);
    uStack_2fb = (undefined1)((ulong)local_378._8_8_ >> 0x28);
    uStack_2fa = (undefined2)((ulong)local_378._8_8_ >> 0x30);
    local_318.string = local_388.string;
    jStack_310.string = jStack_380.string;
    local_378._8_8_ = 0x8000000000000000;
    local_378._M_allocated_capacity = 0;
    jStack_380.object = (object_t *)0x0;
    if (schema->m_type == array) {
      local_378._M_allocated_capacity =
           (size_type)
           (((schema->m_value).array)->
           super__Vector_base<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
    }
    else if (schema->m_type == object) {
      jStack_380.object =
           (object_t *)&(((schema->m_value).object)->_M_t)._M_impl.super__Rb_tree_header;
    }
    else {
      local_378._8_8_ = 1;
    }
    local_388 = (json_value)schema;
    bVar15 = nlohmann::json_abi_v3_11_2::detail::
             iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ::
             operator==<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                       ((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         *)&local_318,
                        (iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         *)&local_388);
    if (!bVar15) {
      pbVar18 = nlohmann::json_abi_v3_11_2::detail::
                iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::operator*((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                             *)&local_318);
      local_388.number_unsigned = local_388.number_unsigned & 0xffffffffffffff00;
      nlohmann::json_abi_v3_11_2::detail::
      from_json<nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                (pbVar18,&local_388.boolean);
      *(boolean_t *)&(local_270->content_check_).super__Function_base._M_manager = local_388.boolean
      ;
      local_e0 = local_318;
      uStack_d0 = CONCAT17(jStack_308.number_integer._7_1_,
                           CONCAT25(jStack_308.number_integer._5_2_,
                                    CONCAT14(jStack_308.number_integer._4_1_,
                                             jStack_308.number_integer._0_4_)));
      local_d8 = jStack_310;
      local_c8 = CONCAT26(uStack_2fa,
                          CONCAT15(uStack_2fb,
                                   CONCAT14(uStack_2fc,
                                            CONCAT13(uStack_2fd,CONCAT12(uStack_2fe,uStack_300)))));
      nlohmann::json_abi_v3_11_2::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::
      erase<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_0>
                ((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)&local_388,schema,
                 (iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)&local_e0);
    }
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::find<const_char_(&)[6],_0>((iterator *)&local_388,schema,(char (*) [6])0x145277);
    jStack_308.number_integer._0_4_ = local_378._M_allocated_capacity._0_4_;
    jStack_308.number_integer._4_1_ = (undefined1)((ulong)local_378._0_8_ >> 0x20);
    jStack_308.number_integer._5_2_ = (undefined2)((ulong)local_378._0_8_ >> 0x28);
    jStack_308.number_integer._7_1_ = (undefined1)((ulong)local_378._0_8_ >> 0x38);
    uStack_300 = (undefined2)local_378._8_8_;
    uStack_2fe = (undefined1)((ulong)local_378._8_8_ >> 0x10);
    uStack_2fd = (undefined1)((ulong)local_378._8_8_ >> 0x18);
    uStack_2fc = (undefined1)((ulong)local_378._8_8_ >> 0x20);
    uStack_2fb = (undefined1)((ulong)local_378._8_8_ >> 0x28);
    uStack_2fa = (undefined2)((ulong)local_378._8_8_ >> 0x30);
    local_318.string = local_388.string;
    jStack_310.string = jStack_380.string;
    local_378._8_8_ = 0x8000000000000000;
    local_378._M_allocated_capacity = 0;
    jStack_380.object = (object_t *)0x0;
    if (schema->m_type == array) {
      local_378._M_allocated_capacity =
           (size_type)
           (((schema->m_value).array)->
           super__Vector_base<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
    }
    else if (schema->m_type == object) {
      jStack_380.object =
           (object_t *)&(((schema->m_value).object)->_M_t)._M_impl.super__Rb_tree_header;
    }
    else {
      local_378._8_8_ = 1;
    }
    local_388 = (json_value)schema;
    bVar15 = nlohmann::json_abi_v3_11_2::detail::
             iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ::
             operator==<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                       ((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         *)&local_318,
                        (iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         *)&local_388);
    if (!bVar15) {
      pbVar18 = nlohmann::json_abi_v3_11_2::detail::
                iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::operator*((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                             *)&local_318);
      if (pbVar18->m_type == array) {
        jVar19.object =
             (object_t *)
             nlohmann::json_abi_v3_11_2::detail::
             iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ::operator*((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                          *)&local_318);
        nlohmann::json_abi_v3_11_2::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::begin((iterator *)&local_2a8,
                (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 *)jVar19.object);
        plStack_240 = (long *)0x8000000000000000;
        pbStack_248 = (pointer)0x0;
        jStack_250.object = (object_t *)0x0;
        if (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)&(jVar19.object)->_M_t)->_M_local_buf[0] == array) {
          pbStack_248 = (((json_value *)
                         (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                            *)&(jVar19.array)->
                               super__Vector_base<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                          )->_M_local_buf + 8))->array->
                        super__Vector_base<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish;
        }
        else if (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)&(jVar19.object)->_M_t)->_M_local_buf[0] == object) {
          jStack_250.object =
               (object_t *)
               &(((json_value *)
                 (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)&(jVar19.array)->
                       super__Vector_base<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                  )->_M_local_buf + 8))->object->_M_t)._M_impl.super__Rb_tree_header;
        }
        else {
          plStack_240 = (long *)0x1;
        }
        local_280 = (root_schema *)0x0;
        local_258.object = jVar19.object;
        while (bVar15 = nlohmann::json_abi_v3_11_2::detail::
                        iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                        ::
                        operator==<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                                  ((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                    *)&local_2a8,
                                   (iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                    *)&local_258), !bVar15) {
          pbVar18 = nlohmann::json_abi_v3_11_2::detail::
                    iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    ::operator*((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                 *)&local_2a8);
          local_388.object = (object_t *)&local_378;
          jStack_380.number_integer = 5;
          local_378._M_allocated_capacity._0_6_ = 0x736d657469;
          cVar33 = '\x01';
          if (9 < local_280) {
            prVar28 = local_280;
            cVar14 = '\x04';
            do {
              cVar33 = cVar14;
              if (prVar28 < 100) {
                cVar33 = cVar33 + -2;
                goto LAB_001219ec;
              }
              if (prVar28 < 1000) {
                cVar33 = cVar33 + -1;
                goto LAB_001219ec;
              }
              if (prVar28 < 10000) goto LAB_001219ec;
              bVar15 = 99999 < prVar28;
              prVar28 = (root_schema *)((ulong)prVar28 / 10000);
              cVar14 = cVar33 + '\x04';
            } while (bVar15);
            cVar33 = cVar33 + '\x01';
          }
LAB_001219ec:
          local_368._M_allocated_capacity = (size_type)local_358;
          std::__cxx11::string::_M_construct((ulong)&local_368,cVar33);
          std::__detail::__to_chars_10_impl<unsigned_long>
                    ((char *)local_368._M_allocated_capacity,local_368._8_4_,
                     (unsigned_long)local_280);
          __l_05._M_len = 2;
          __l_05._M_array = (iterator)&local_388;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_228,__l_05,(allocator_type *)local_208);
          std::vector<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_>::vector
                    ((vector<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_> *)&local_68,
                     (vector<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_> *)local_260);
          anon_unknown.dwarf_68875::schema::make
                    ((schema *)(local_1e8 + 0x18),pbVar18,local_278,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_228,
                     (vector<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_> *)&local_68);
          std::
          vector<std::shared_ptr<(anonymous_namespace)::schema>,_std::allocator<std::shared_ptr<(anonymous_namespace)::schema>_>_>
          ::push_back((vector<std::shared_ptr<(anonymous_namespace)::schema>,_std::allocator<std::shared_ptr<(anonymous_namespace)::schema>_>_>
                       *)local_268,(value_type *)(local_1e8 + 0x18));
          if ((_Rb_tree_node_base *)local_1c8.object != (_Rb_tree_node_base *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c8.object);
          }
          local_280 = (root_schema *)((long)local_280 + 1);
          std::vector<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_>::~vector
                    ((vector<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_> *)&local_68);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_228);
          lVar35 = -0x40;
          plVar38 = local_358;
          do {
            if (plVar38 != (long *)plVar38[-2]) {
              operator_delete((long *)plVar38[-2],*plVar38 + 1);
            }
            plVar38 = plVar38 + -4;
            lVar35 = lVar35 + 0x20;
          } while (lVar35 != 0);
          if (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)&(local_2a8.object)->_M_t)->_M_local_buf[0] == array) {
            lVar35 = CONCAT17(uStack_291,uStack_298) + 0x10;
            uStack_298 = (undefined7)lVar35;
            uStack_291 = (undefined1)((ulong)lVar35 >> 0x38);
          }
          else if (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)&(local_2a8.object)->_M_t)->_M_local_buf[0] == object) {
            jStack_2a0.string = (string_t *)std::_Rb_tree_increment(jStack_2a0.string);
          }
          else {
            lVar35 = CONCAT17(uStack_289,uStack_290) + 1;
            uStack_290 = (undefined7)lVar35;
            uStack_289 = (undefined1)((ulong)lVar35 >> 0x38);
          }
        }
        nlohmann::json_abi_v3_11_2::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::find<const_char_(&)[16],_0>
                  ((iterator *)&local_388,schema,(char (*) [16])"additionalItems");
        uStack_289 = 0x80;
        uStack_290 = 0;
        uStack_291 = 0;
        uStack_298 = 0;
        jStack_2a0.object = (object_t *)0x0;
        if (schema->m_type == array) {
          sVar4 = ((schema->m_value).string)->_M_string_length;
          uStack_298 = (undefined7)sVar4;
          uStack_291 = (undefined1)(sVar4 >> 0x38);
        }
        else if (schema->m_type == object) {
          jStack_2a0.object =
               (object_t *)&(((schema->m_value).object)->_M_t)._M_impl.super__Rb_tree_header;
        }
        else {
          uStack_290 = 1;
          uStack_289 = 0;
        }
        local_2a8 = (json_value)schema;
        bVar15 = nlohmann::json_abi_v3_11_2::detail::
                 iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 ::
                 operator==<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                           ((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                             *)&local_388,
                            (iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                             *)&local_2a8);
        if (!bVar15) {
          pbVar18 = nlohmann::json_abi_v3_11_2::detail::
                    iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    ::operator*((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                 *)&local_388);
          uStack_298 = 0x6f697469646461;
          uStack_291 = 0x6e;
          uStack_290 = 0x736d6574496c61;
          jStack_2a0 = (json_value)0xf;
          uStack_289 = 0;
          __l_06._M_len = 1;
          __l_06._M_array = (iterator)&local_2a8;
          local_2a8.object = (object_t *)&uStack_298;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_258,__l_06,(allocator_type *)local_208);
          std::vector<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_>::vector
                    ((vector<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_> *)
                     (local_1e8 + 0x18),
                     (vector<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_> *)local_260);
          anon_unknown.dwarf_68875::schema::make
                    ((schema *)&local_228,pbVar18,local_278,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_258,
                     (vector<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_> *)
                     (local_1e8 + 0x18));
          jVar9 = jStack_220;
          jVar19 = local_228;
          local_228.object = (object_t *)0x0;
          jStack_220.object = (object_t *)0x0;
          this_02 = (local_270->files_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (local_270->files_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
               (_Base_ptr)jVar19;
          (local_270->files_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               (_Base_ptr)jVar9;
          if (this_02 != (_Base_ptr)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_02);
          }
          if ((_Base_ptr)jStack_220.object != (_Base_ptr)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)jStack_220.object);
          }
          std::vector<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_>::~vector
                    ((vector<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_> *)
                     (local_1e8 + 0x18));
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_258);
          if (local_2a8.object != (object_t *)&uStack_298) {
            operator_delete(local_2a8.object,CONCAT17(uStack_291,uStack_298) + 1);
          }
          local_2a8 = local_388;
          jStack_2a0 = jStack_380;
          uStack_298 = (undefined7)local_378._M_allocated_capacity;
          uStack_291 = (undefined1)((ulong)local_378._0_8_ >> 0x38);
          uStack_290 = (undefined7)local_378._8_8_;
          uStack_289 = (undefined1)((ulong)local_378._8_8_ >> 0x38);
          nlohmann::json_abi_v3_11_2::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::
          erase<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_0>
                    ((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                      *)&local_258,schema,
                     (iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                      *)&local_2a8);
        }
      }
      else {
        pbVar18 = nlohmann::json_abi_v3_11_2::detail::
                  iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  ::operator*((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                               *)&local_318);
        if ((pbVar18->m_type == object) ||
           (pbVar18 = nlohmann::json_abi_v3_11_2::detail::
                      iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                      ::operator*((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                   *)&local_318), pbVar18->m_type == boolean)) {
          pbVar18 = nlohmann::json_abi_v3_11_2::detail::
                    iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    ::operator*((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                 *)&local_318);
          local_378._M_allocated_capacity._0_6_ = 0x736d657469;
          jStack_380.number_integer = 5;
          __l_04._M_len = 1;
          __l_04._M_array = (iterator)&local_388;
          local_388.object = (object_t *)&local_378;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_2a8,__l_04,(allocator_type *)&local_228.boolean);
          std::vector<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_>::vector
                    ((vector<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_> *)&local_68,
                     (vector<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_> *)local_260);
          anon_unknown.dwarf_68875::schema::make
                    ((schema *)&local_258,pbVar18,local_278,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_2a8,
                     (vector<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_> *)&local_68);
          jVar9 = jStack_250;
          jVar19 = local_258;
          local_258.object = (object_t *)0x0;
          jStack_250.object = (object_t *)0x0;
          this_01 = (local_270->root_).
                    super___shared_ptr<(anonymous_namespace)::schema,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr;
          (local_270->content_check_)._M_invoker = (_Invoker_type)jVar19;
          (local_270->root_).
          super___shared_ptr<(anonymous_namespace)::schema,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)jVar9;
          if (this_01 != (element_type *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01);
          }
          if ((_Rb_tree_node_base *)jStack_250.object != (_Rb_tree_node_base *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)jStack_250.object);
          }
          std::vector<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_>::~vector
                    ((vector<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_> *)&local_68);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_2a8);
          if (local_388.object != (object_t *)&local_378) {
            operator_delete(local_388.object,local_378._M_allocated_capacity + 1);
          }
        }
      }
      local_388 = local_318;
      local_378._M_allocated_capacity =
           CONCAT17(jStack_308.number_integer._7_1_,
                    CONCAT25(jStack_308.number_integer._5_2_,
                             CONCAT14(jStack_308.number_integer._4_1_,
                                      jStack_308.number_integer._0_4_)));
      jStack_380 = jStack_310;
      local_378._8_8_ =
           CONCAT26(uStack_2fa,
                    CONCAT15(uStack_2fb,
                             CONCAT14(uStack_2fc,
                                      CONCAT13(uStack_2fd,CONCAT12(uStack_2fe,uStack_300)))));
      nlohmann::json_abi_v3_11_2::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::
      erase<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_0>
                ((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)&local_258,schema,
                 (iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)&local_388);
    }
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::find<const_char_(&)[9],_0>((iterator *)&local_258,schema,(char (*) [9])"contains");
    jStack_308.number_integer._0_4_ = SUB84(pbStack_248,0);
    jStack_308.number_integer._4_1_ = (undefined1)((ulong)pbStack_248 >> 0x20);
    jStack_308.number_integer._5_2_ = (undefined2)((ulong)pbStack_248 >> 0x28);
    jStack_308.number_integer._7_1_ = (undefined1)((ulong)pbStack_248 >> 0x38);
    uStack_300 = SUB82(plStack_240,0);
    uStack_2fe = (undefined1)((ulong)plStack_240 >> 0x10);
    uStack_2fd = (undefined1)((ulong)plStack_240 >> 0x18);
    uStack_2fc = (undefined1)((ulong)plStack_240 >> 0x20);
    uStack_2fb = (undefined1)((ulong)plStack_240 >> 0x28);
    uStack_2fa = (undefined2)((ulong)plStack_240 >> 0x30);
    local_318 = local_258;
    jStack_310 = jStack_250;
    plStack_240 = (long *)0x8000000000000000;
    pbStack_248 = (pointer)0x0;
    jStack_250.object = (object_t *)0x0;
    if (schema->m_type == array) {
      pbStack_248 = (((schema->m_value).array)->
                    super__Vector_base<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish;
    }
    else if (schema->m_type == object) {
      jStack_250.object =
           (object_t *)&(((schema->m_value).object)->_M_t)._M_impl.super__Rb_tree_header;
    }
    else {
      plStack_240 = (long *)0x1;
    }
    local_258 = (json_value)schema;
    bVar15 = nlohmann::json_abi_v3_11_2::detail::
             iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ::
             operator==<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                       ((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         *)&local_318,
                        (iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         *)&local_258);
    if (!bVar15) {
      pbVar18 = nlohmann::json_abi_v3_11_2::detail::
                iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::operator*((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                             *)&local_318);
      pbStack_248 = (pointer)0x736e6961746e6f63;
      jStack_250.number_integer = 8;
      plStack_240 = (long *)((ulong)plStack_240 & 0xffffffffffffff00);
      __l_07._M_len = 1;
      __l_07._M_array = (iterator)&local_258;
      local_258.object = (object_t *)&pbStack_248;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_228,__l_07,(allocator_type *)&local_1b0);
      std::vector<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_>::vector
                ((vector<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_> *)local_208,
                 (vector<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_> *)local_260);
      anon_unknown.dwarf_68875::schema::make
                (&local_88,pbVar18,local_278,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_228,
                 (vector<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_> *)local_208);
      prVar28 = local_88.root_;
      pp_Var13 = local_88._vptr_schema;
      local_88._vptr_schema = (_func_int **)0x0;
      local_88.root_ = (root_schema *)0x0;
      p_Var6 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               (local_270->files_)._M_t._M_impl.super__Rb_tree_header._M_node_count;
      (local_270->files_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           (_Base_ptr)pp_Var13;
      (local_270->files_)._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)prVar28;
      if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
      }
      if (local_88.root_ != (root_schema *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88.root_);
      }
      std::vector<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_>::~vector
                ((vector<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_> *)local_208);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_228);
      if (local_258.object != (object_t *)&pbStack_248) {
        operator_delete(local_258.object,(long)pbStack_248 + 1);
      }
      local_258 = local_318;
      pbStack_248 = (pointer)CONCAT17(jStack_308.number_integer._7_1_,
                                      CONCAT25(jStack_308.number_integer._5_2_,
                                               CONCAT14(jStack_308.number_integer._4_1_,
                                                        jStack_308.number_integer._0_4_)));
      jStack_250 = jStack_310;
      plStack_240 = (long *)CONCAT26(uStack_2fa,
                                     CONCAT15(uStack_2fb,
                                              CONCAT14(uStack_2fc,
                                                       CONCAT13(uStack_2fd,
                                                                CONCAT12(uStack_2fe,uStack_300)))));
      nlohmann::json_abi_v3_11_2::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::
      erase<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_0>
                ((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)&local_228,schema,
                 (iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)&local_258);
    }
    (local_238->super_schema)._vptr_schema =
         (_func_int **)&(prVar16->loader_).super__Function_base._M_manager;
    this = local_238;
    break;
  case 3:
    prVar16 = (root_schema *)operator_new(0x108);
    *(undefined8 *)((long)&(prVar16->loader_).super__Function_base._M_functor + 8) = 0x100000001;
    *(undefined ***)&(prVar16->loader_).super__Function_base._M_functor =
         &PTR___Sp_counted_ptr_inplace_0015a420;
    (prVar16->loader_)._M_invoker = (_Invoker_type)local_278;
    (prVar16->format_check_).super__Function_base._M_functor._M_pod_data[0] = '\0';
    *(undefined8 *)((long)&(prVar16->format_check_).super__Function_base._M_functor + 8) = 0;
    (prVar16->loader_).super__Function_base._M_manager =
         (_Manager_type)&PTR_make_for_default__0015a470;
    *(undefined1 *)&(prVar16->format_check_).super__Function_base._M_manager = 0;
    (prVar16->format_check_)._M_invoker = (_Invoker_type)0x0;
    (prVar16->content_check_).super__Function_base._M_functor._M_pod_data[0] = '\0';
    *(undefined8 *)((long)&(prVar16->content_check_).super__Function_base._M_functor + 8) = 0;
    local_388.number_integer._0_4_ = 0x10;
    std::locale::locale((locale *)&jStack_380.boolean);
    local_378._M_allocated_capacity = 0;
    local_378._8_8_ = 0;
    *(undefined1 *)&(prVar16->content_check_).super__Function_base._M_manager = 0;
    *(undefined4 *)&(prVar16->content_check_)._M_invoker = local_388.number_integer._0_4_;
    std::locale::locale((locale *)&prVar16->root_,(locale *)&jStack_380.boolean);
    uVar7 = local_378._8_8_;
    *(undefined8 *)&(prVar16->files_)._M_t._M_impl = 0;
    local_378._8_8_ = 0;
    (prVar16->root_).super___shared_ptr<(anonymous_namespace)::schema,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_378._M_allocated_capacity;
    *(undefined8 *)&(prVar16->files_)._M_t._M_impl = uVar7;
    local_378._M_allocated_capacity = 0;
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
              ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&local_388);
    local_260 = (string *)&(prVar16->files_)._M_t._M_impl.super__Rb_tree_header;
    local_268 = (format_checker *)
                &(prVar16->files_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    *(format_checker **)&(prVar16->files_)._M_t._M_impl.super__Rb_tree_header._M_header = local_268;
    (prVar16->files_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    *(undefined1 *)&(prVar16->files_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = 0;
    *(undefined1 *)&(prVar16->files_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_280 = prVar16 + 1;
    local_270 = (root_schema *)&prVar16[1].loader_.super__Function_base._M_manager;
    *(root_schema **)&prVar16[1].loader_.super__Function_base._M_functor = local_270;
    *(undefined8 *)((long)&prVar16[1].loader_.super__Function_base._M_functor + 8) = 0;
    *(undefined1 *)&prVar16[1].loader_.super__Function_base._M_manager = 0;
    local_278 = (root_schema *)&prVar16[1].format_check_;
    std::_Tuple_impl<1ul,std::__cxx11::string,std::__cxx11::string>::
    _Tuple_impl<char_const(&)[1],char_const(&)[1],void>
              ((_Tuple_impl<1ul,std::__cxx11::string,std::__cxx11::string> *)local_278,
               (char (*) [1])0x144772,(char (*) [1])0x144772);
    *(undefined1 *)
     &prVar16[1].root_.super___shared_ptr<(anonymous_namespace)::schema,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = 0;
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::find<const_char_(&)[10],_0>((iterator *)&local_318,schema,(char (*) [10])"maxLength");
    local_378._8_8_ = 0x8000000000000000;
    local_378._M_allocated_capacity = 0;
    jStack_380.object = (object_t *)0x0;
    if (schema->m_type == array) {
      local_378._M_allocated_capacity =
           (size_type)
           (((schema->m_value).array)->
           super__Vector_base<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
    }
    else if (schema->m_type == object) {
      jStack_380.object =
           (object_t *)&(((schema->m_value).object)->_M_t)._M_impl.super__Rb_tree_header;
    }
    else {
      local_378._8_8_ = 1;
    }
    local_388 = (json_value)schema;
    bVar15 = nlohmann::json_abi_v3_11_2::detail::
             iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ::
             operator==<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                       ((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         *)&local_318,
                        (iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         *)&local_388);
    if (!bVar15) {
      pbVar18 = nlohmann::json_abi_v3_11_2::detail::
                iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::operator*((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                             *)&local_318);
      local_388.object = (object_t *)0x0;
      nlohmann::json_abi_v3_11_2::detail::
      get_arithmetic_value<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_unsigned_long,_0>
                (pbVar18,&local_388.number_unsigned);
      *(undefined1 *)&(prVar16->format_check_).super__Function_base._M_manager = 1;
      (prVar16->format_check_)._M_invoker = (_Invoker_type)local_388;
      local_198 = local_318;
      p_Stack_190 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)jStack_310;
      nlohmann::json_abi_v3_11_2::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::
      erase<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_0>
                ((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)&local_388,schema,
                 (iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)&local_198);
    }
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::find<const_char_(&)[10],_0>((iterator *)&local_388,schema,(char (*) [10])"minLength");
    jStack_308.number_integer._0_4_ = (undefined4)local_378._M_allocated_capacity;
    jStack_308.number_integer._4_1_ = (undefined1)((ulong)local_378._0_8_ >> 0x20);
    jStack_308.number_integer._5_2_ = (undefined2)((ulong)local_378._0_8_ >> 0x28);
    jStack_308.number_integer._7_1_ = (undefined1)((ulong)local_378._0_8_ >> 0x38);
    uStack_300 = (undefined2)local_378._8_8_;
    uStack_2fe = (undefined1)((ulong)local_378._8_8_ >> 0x10);
    uStack_2fd = (undefined1)((ulong)local_378._8_8_ >> 0x18);
    uStack_2fc = (undefined1)((ulong)local_378._8_8_ >> 0x20);
    uStack_2fb = (undefined1)((ulong)local_378._8_8_ >> 0x28);
    uStack_2fa = (undefined2)((ulong)local_378._8_8_ >> 0x30);
    local_318.string = local_388.string;
    jStack_310.string = jStack_380.string;
    local_378._8_8_ = 0x8000000000000000;
    local_378._M_allocated_capacity = 0;
    jStack_380.object = (object_t *)0x0;
    if (schema->m_type == array) {
      local_378._M_allocated_capacity =
           (size_type)
           (((schema->m_value).array)->
           super__Vector_base<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
    }
    else if (schema->m_type == object) {
      jStack_380.object =
           (object_t *)&(((schema->m_value).object)->_M_t)._M_impl.super__Rb_tree_header;
    }
    else {
      local_378._8_8_ = 1;
    }
    local_388 = (json_value)schema;
    bVar15 = nlohmann::json_abi_v3_11_2::detail::
             iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ::
             operator==<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                       ((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         *)&local_318,
                        (iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         *)&local_388);
    if (!bVar15) {
      pbVar18 = nlohmann::json_abi_v3_11_2::detail::
                iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::operator*((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                             *)&local_318);
      local_388.object = (object_t *)0x0;
      nlohmann::json_abi_v3_11_2::detail::
      get_arithmetic_value<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_unsigned_long,_0>
                (pbVar18,&local_388.number_unsigned);
      (prVar16->content_check_).super__Function_base._M_functor._M_pod_data[0] = '\x01';
      ((json_value *)((long)&(prVar16->content_check_).super__Function_base._M_functor + 8))->object
           = (object_t *)local_388;
      local_120 = local_318;
      uStack_110 = CONCAT17(jStack_308.number_integer._7_1_,
                            CONCAT25(jStack_308.number_integer._5_2_,
                                     CONCAT14(jStack_308.number_integer._4_1_,
                                              jStack_308.number_integer._0_4_)));
      local_118 = jStack_310;
      local_108 = CONCAT26(uStack_2fa,
                           CONCAT15(uStack_2fb,
                                    CONCAT14(uStack_2fc,
                                             CONCAT13(uStack_2fd,CONCAT12(uStack_2fe,uStack_300)))))
      ;
      nlohmann::json_abi_v3_11_2::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::
      erase<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_0>
                ((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)&local_388,schema,
                 (iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)&local_120);
    }
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::find<const_char_(&)[16],_0>((iterator *)&local_388,schema,(char (*) [16])"contentEncoding");
    jStack_308.number_integer._0_4_ = (undefined4)local_378._M_allocated_capacity;
    jStack_308.number_integer._4_1_ = (undefined1)((ulong)local_378._0_8_ >> 0x20);
    jStack_308.number_integer._5_2_ = (undefined2)((ulong)local_378._0_8_ >> 0x28);
    jStack_308.number_integer._7_1_ = (undefined1)((ulong)local_378._0_8_ >> 0x38);
    uStack_300 = (undefined2)local_378._8_8_;
    uStack_2fe = (undefined1)((ulong)local_378._8_8_ >> 0x10);
    uStack_2fd = (undefined1)((ulong)local_378._8_8_ >> 0x18);
    uStack_2fc = (undefined1)((ulong)local_378._8_8_ >> 0x20);
    uStack_2fb = (undefined1)((ulong)local_378._8_8_ >> 0x28);
    uStack_2fa = (undefined2)((ulong)local_378._8_8_ >> 0x30);
    local_318.string = local_388.string;
    jStack_310.string = jStack_380.string;
    local_378._8_8_ = 0x8000000000000000;
    local_378._M_allocated_capacity = 0;
    jStack_380.object = (object_t *)0x0;
    if (schema->m_type == array) {
      local_378._M_allocated_capacity =
           (size_type)
           (((schema->m_value).array)->
           super__Vector_base<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
    }
    else if (schema->m_type == object) {
      jStack_380.object =
           (object_t *)&(((schema->m_value).object)->_M_t)._M_impl.super__Rb_tree_header;
    }
    else {
      local_378._8_8_ = 1;
    }
    local_388 = (json_value)schema;
    bVar15 = nlohmann::json_abi_v3_11_2::detail::
             iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ::
             operator==<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                       ((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         *)&local_318,
                        (iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         *)&local_388);
    if (!bVar15) {
      *(undefined1 *)
       &prVar16[1].root_.
        super___shared_ptr<(anonymous_namespace)::schema,_(__gnu_cxx::_Lock_policy)2>._M_ptr = 1;
      pbVar18 = nlohmann::json_abi_v3_11_2::detail::
                iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::operator*((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                             *)&local_318);
      nlohmann::json_abi_v3_11_2::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (&local_388,pbVar18);
      std::__cxx11::string::operator=
                ((string *)&prVar16[1].content_check_,(string *)&local_388.boolean);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_388.object != &local_378) {
        operator_delete(local_388.object,(ulong)(local_378._M_allocated_capacity + 1));
      }
      local_e0 = local_318;
      uStack_d0 = CONCAT17(jStack_308.number_integer._7_1_,
                           CONCAT25(jStack_308.number_integer._5_2_,
                                    CONCAT14(jStack_308.number_integer._4_1_,
                                             jStack_308.number_integer._0_4_)));
      local_d8 = jStack_310;
      local_c8 = CONCAT26(uStack_2fa,
                          CONCAT15(uStack_2fb,
                                   CONCAT14(uStack_2fc,
                                            CONCAT13(uStack_2fd,CONCAT12(uStack_2fe,uStack_300)))));
      nlohmann::json_abi_v3_11_2::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::
      erase<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_0>
                ((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)&local_388,schema,
                 (iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)&local_e0);
    }
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::find<const_char_(&)[17],_0>((iterator *)&local_388,schema,(char (*) [17])"contentMediaType");
    jStack_308.number_integer._0_4_ = (undefined4)local_378._M_allocated_capacity;
    jStack_308.number_integer._4_1_ = (undefined1)((ulong)local_378._0_8_ >> 0x20);
    jStack_308.number_integer._5_2_ = (undefined2)((ulong)local_378._0_8_ >> 0x28);
    jStack_308.number_integer._7_1_ = (undefined1)((ulong)local_378._0_8_ >> 0x38);
    uStack_300 = (undefined2)local_378._8_8_;
    uStack_2fe = (undefined1)((ulong)local_378._8_8_ >> 0x10);
    uStack_2fd = (undefined1)((ulong)local_378._8_8_ >> 0x18);
    uStack_2fc = (undefined1)((ulong)local_378._8_8_ >> 0x20);
    uStack_2fb = (undefined1)((ulong)local_378._8_8_ >> 0x28);
    uStack_2fa = (undefined2)((ulong)local_378._8_8_ >> 0x30);
    local_318.string = local_388.string;
    jStack_310.string = jStack_380.string;
    local_378._8_8_ = 0x8000000000000000;
    local_378._M_allocated_capacity = 0;
    jStack_380.object = (object_t *)0x0;
    if (schema->m_type == array) {
      local_378._M_allocated_capacity =
           (size_type)
           (((schema->m_value).array)->
           super__Vector_base<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
    }
    else if (schema->m_type == object) {
      jStack_380.object =
           (object_t *)&(((schema->m_value).object)->_M_t)._M_impl.super__Rb_tree_header;
    }
    else {
      local_378._8_8_ = 1;
    }
    local_388 = (json_value)schema;
    bVar15 = nlohmann::json_abi_v3_11_2::detail::
             iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ::
             operator==<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                       ((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         *)&local_318,
                        (iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         *)&local_388);
    if (!bVar15) {
      *(undefined1 *)
       &prVar16[1].root_.
        super___shared_ptr<(anonymous_namespace)::schema,_(__gnu_cxx::_Lock_policy)2>._M_ptr = 1;
      pbVar18 = nlohmann::json_abi_v3_11_2::detail::
                iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::operator*((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                             *)&local_318);
      nlohmann::json_abi_v3_11_2::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (&local_388,pbVar18);
      std::__cxx11::string::operator=((string *)local_278,(string *)&local_388.boolean);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_388.object != &local_378) {
        operator_delete(local_388.object,(ulong)(local_378._M_allocated_capacity + 1));
      }
      local_2a8 = local_318;
      uStack_298 = CONCAT25(jStack_308.number_integer._5_2_,
                            CONCAT14(jStack_308.number_integer._4_1_,jStack_308.number_integer._0_4_
                                    ));
      jStack_2a0 = jStack_310;
      uStack_291 = jStack_308.number_integer._7_1_;
      uStack_290 = (undefined7)
                   CONCAT26(uStack_2fa,
                            CONCAT15(uStack_2fb,
                                     CONCAT14(uStack_2fc,
                                              CONCAT13(uStack_2fd,CONCAT12(uStack_2fe,uStack_300))))
                           );
      uStack_289 = (undefined1)((ushort)uStack_2fa >> 8);
      nlohmann::json_abi_v3_11_2::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::
      erase<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_0>
                ((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)&local_388,schema,
                 (iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)&local_2a8);
    }
    if ((*(char *)&prVar16[1].root_.
                   super___shared_ptr<(anonymous_namespace)::schema,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr == '\x01') && (*(long *)((prVar16->loader_)._M_invoker + 0x50) == 0)) {
      piVar27 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument
                (piVar27,
                 "schema contains contentEncoding/contentMediaType but content checker was not set")
      ;
      __cxa_throw(piVar27,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument)
      ;
    }
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::find<const_char_(&)[8],_0>((iterator *)&local_388,schema,(char (*) [8])"pattern");
    jStack_308.number_integer._0_4_ = (undefined4)local_378._M_allocated_capacity;
    jStack_308.number_integer._4_1_ = (undefined1)((ulong)local_378._0_8_ >> 0x20);
    jStack_308.number_integer._5_2_ = (undefined2)((ulong)local_378._0_8_ >> 0x28);
    jStack_308.number_integer._7_1_ = (undefined1)((ulong)local_378._0_8_ >> 0x38);
    uStack_300 = (undefined2)local_378._8_8_;
    uStack_2fe = (undefined1)((ulong)local_378._8_8_ >> 0x10);
    uStack_2fd = (undefined1)((ulong)local_378._8_8_ >> 0x18);
    uStack_2fc = (undefined1)((ulong)local_378._8_8_ >> 0x20);
    uStack_2fb = (undefined1)((ulong)local_378._8_8_ >> 0x28);
    uStack_2fa = (undefined2)((ulong)local_378._8_8_ >> 0x30);
    local_318.string = local_388.string;
    jStack_310.string = jStack_380.string;
    local_378._8_8_ = (pointer)0x8000000000000000;
    local_378._M_allocated_capacity = 0;
    jStack_380.object = (object_t *)0x0;
    if (schema->m_type == array) {
      local_378._M_allocated_capacity =
           (size_type)
           (((schema->m_value).array)->
           super__Vector_base<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
    }
    else if (schema->m_type == object) {
      jStack_380.object =
           (object_t *)&(((schema->m_value).object)->_M_t)._M_impl.super__Rb_tree_header;
    }
    else {
      local_378._8_8_ = (pointer)0x1;
    }
    local_388 = (json_value)schema;
    bVar15 = nlohmann::json_abi_v3_11_2::detail::
             iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ::
             operator==<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                       ((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         *)&local_318,
                        (iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         *)&local_388);
    if (!bVar15) {
      pbVar18 = nlohmann::json_abi_v3_11_2::detail::
                iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::operator*((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                             *)&local_318);
      nlohmann::json_abi_v3_11_2::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (&local_388,pbVar18);
      std::__cxx11::string::operator=(local_260,(string *)&local_388.boolean);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_388.object != &local_378) {
        operator_delete(local_388.object,(ulong)(local_378._M_allocated_capacity + 1));
      }
      pbVar18 = nlohmann::json_abi_v3_11_2::detail::
                iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::operator*((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                             *)&local_318);
      nlohmann::json_abi_v3_11_2::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (&local_228,pbVar18);
      std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>::
      basic_regex<std::char_traits<char>,std::allocator<char>>
                ((basic_regex<char,std::__cxx11::regex_traits<char>> *)&local_258.boolean,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_228,
                 0x10);
      local_388.boolean = true;
      jStack_380.number_integer._0_4_ = local_258.number_integer._0_4_;
      std::locale::locale((locale *)local_378._M_local_buf,(locale *)&jStack_250.boolean);
      local_378._8_8_ = pbStack_248;
      local_368._M_allocated_capacity = (size_type)plStack_240;
      pbStack_248 = (pointer)0x0;
      plStack_240 = (long *)0x0;
      *(boolean_t *)&(prVar16->content_check_).super__Function_base._M_manager = local_388.boolean;
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::operator=
                ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
                 &(prVar16->content_check_)._M_invoker,
                 (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&jStack_380);
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
                ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&jStack_380);
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
                ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&local_258);
      if ((json_value *)local_228.object != &local_218) {
        operator_delete(local_228.object,local_218.number_integer + 1);
      }
      local_258 = local_318;
      pbStack_248 = (pointer)CONCAT17(jStack_308.number_integer._7_1_,
                                      CONCAT25(jStack_308.number_integer._5_2_,
                                               CONCAT14(jStack_308.number_integer._4_1_,
                                                        jStack_308.number_integer._0_4_)));
      jStack_250 = jStack_310;
      plStack_240 = (long *)CONCAT26(uStack_2fa,
                                     CONCAT15(uStack_2fb,
                                              CONCAT14(uStack_2fc,
                                                       CONCAT13(uStack_2fd,
                                                                CONCAT12(uStack_2fe,uStack_300)))));
      nlohmann::json_abi_v3_11_2::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::
      erase<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_0>
                ((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)&local_388,schema,
                 (iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)&local_258);
    }
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::find<const_char_(&)[7],_0>((iterator *)&local_388,schema,(char (*) [7])"format");
    jStack_308.number_integer._0_4_ = (undefined4)local_378._M_allocated_capacity;
    jStack_308.number_integer._4_1_ = (undefined1)((ulong)local_378._0_8_ >> 0x20);
    jStack_308.number_integer._5_2_ = (undefined2)((ulong)local_378._0_8_ >> 0x28);
    jStack_308.number_integer._7_1_ = (undefined1)((ulong)local_378._0_8_ >> 0x38);
    uStack_300 = (undefined2)local_378._8_8_;
    uStack_2fe = (undefined1)((ulong)local_378._8_8_ >> 0x10);
    uStack_2fd = (undefined1)((ulong)local_378._8_8_ >> 0x18);
    uStack_2fc = (undefined1)((ulong)local_378._8_8_ >> 0x20);
    uStack_2fb = (undefined1)((ulong)local_378._8_8_ >> 0x28);
    uStack_2fa = (undefined2)((ulong)local_378._8_8_ >> 0x30);
    local_318.string = local_388.string;
    jStack_310.string = jStack_380.string;
    local_378._8_8_ = 0x8000000000000000;
    local_378._M_allocated_capacity = 0;
    jStack_380.object = (object_t *)0x0;
    if (schema->m_type == array) {
      local_378._M_allocated_capacity =
           (size_type)
           (((schema->m_value).array)->
           super__Vector_base<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
    }
    else if (schema->m_type == object) {
      jStack_380.object =
           (object_t *)&(((schema->m_value).object)->_M_t)._M_impl.super__Rb_tree_header;
    }
    else {
      local_378._8_8_ = 1;
    }
    local_388 = (json_value)schema;
    bVar15 = nlohmann::json_abi_v3_11_2::detail::
             iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ::
             operator==<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                       ((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         *)&local_318,
                        (iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         *)&local_388);
    if (!bVar15) {
      if (*(long *)((prVar16->loader_)._M_invoker + 0x30) == 0) {
        piVar27 = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_388,
                       "a format checker was not provided but a format keyword for this string is present: "
                       ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_280);
        std::invalid_argument::invalid_argument(piVar27,(string *)&local_388.boolean);
        __cxa_throw(piVar27,&std::invalid_argument::typeinfo,
                    std::invalid_argument::~invalid_argument);
      }
      pbVar18 = nlohmann::json_abi_v3_11_2::detail::
                iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::operator*((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                             *)&local_318);
      nlohmann::json_abi_v3_11_2::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (&local_228,pbVar18);
      local_388.boolean = true;
      if (local_228.object == (object_t *)&local_218) {
        local_368._M_allocated_capacity = (size_type)plStack_210;
        jStack_380.object = (object_t *)(local_378._M_local_buf + 8);
      }
      else {
        jStack_380.string = local_228.string;
      }
      local_378._8_8_ = local_218;
      local_378._M_allocated_capacity = (size_type)jStack_220;
      jStack_220 = (json_value)0x0;
      local_218.number_unsigned = local_218.number_unsigned & 0xffffffffffffff00;
      *(undefined1 *)&(prVar16->files_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 1;
      local_228.object = (object_t *)&local_218;
      std::__cxx11::string::operator=((string *)local_280,(string *)&jStack_380.boolean);
      if (jStack_380.object != (object_t *)(local_378._M_local_buf + 8)) {
        operator_delete(jStack_380.object,local_378._8_8_ + 1);
      }
      if (local_228.object != (object_t *)&local_218) {
        operator_delete(local_228.object,local_218.number_integer + 1);
      }
      local_388 = local_318;
      local_378._M_allocated_capacity =
           CONCAT17(jStack_308.number_integer._7_1_,
                    CONCAT25(jStack_308.number_integer._5_2_,
                             CONCAT14(jStack_308.number_integer._4_1_,
                                      jStack_308.number_integer._0_4_)));
      jStack_380 = jStack_310;
      local_378._8_8_ =
           CONCAT26(uStack_2fa,
                    CONCAT15(uStack_2fb,
                             CONCAT14(uStack_2fc,
                                      CONCAT13(uStack_2fd,CONCAT12(uStack_2fe,uStack_300)))));
      nlohmann::json_abi_v3_11_2::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::
      erase<nlohmann::json_abi_v3_11_2::detail::iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_0>
                ((iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)&local_228,schema,
                 (iter_impl<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)&local_388);
    }
    (local_238->super_schema)._vptr_schema =
         (_func_int **)&(prVar16->loader_).super__Function_base._M_manager;
    this = local_238;
    goto LAB_001218b7;
  case 4:
    local_270 = (root_schema *)operator_new(0x30);
    *(undefined8 *)((long)&(local_270->loader_).super__Function_base._M_functor + 8) = 0x100000001;
    *(undefined ***)&(local_270->loader_).super__Function_base._M_functor =
         &PTR___Sp_counted_ptr_inplace_0015a4c0;
    (local_270->loader_)._M_invoker = (_Invoker_type)local_278;
    (local_270->format_check_).super__Function_base._M_functor._M_pod_data[0] = '\0';
    *(undefined8 *)((long)&(local_270->format_check_).super__Function_base._M_functor + 8) = 0;
    ppuVar29 = &PTR_make_for_default__0015a510;
LAB_0011e381:
    (local_270->loader_).super__Function_base._M_manager = (_Manager_type)ppuVar29;
    (local_238->super_schema)._vptr_schema =
         (_func_int **)&(local_270->loader_).super__Function_base._M_manager;
    this = local_238;
    break;
  case 5:
  case 6:
    prVar16 = (root_schema *)operator_new(0x68);
    *(undefined8 *)((long)&(prVar16->loader_).super__Function_base._M_functor + 8) = 0x100000001;
    *(undefined ***)&(prVar16->loader_).super__Function_base._M_functor =
         &PTR___Sp_counted_ptr_inplace_0015a2e0;
    (prVar16->loader_)._M_invoker = (_Invoker_type)local_278;
    (prVar16->format_check_).super__Function_base._M_functor._M_pod_data[0] = '\0';
    *(undefined8 *)((long)&(prVar16->format_check_).super__Function_base._M_functor + 8) = 0;
    (prVar16->loader_).super__Function_base._M_manager =
         (_Manager_type)&PTR_make_for_default__0015a330;
    *(undefined1 *)&(prVar16->format_check_).super__Function_base._M_manager = 0;
    (prVar16->format_check_)._M_invoker = (_Invoker_type)0x0;
    (prVar16->content_check_).super__Function_base._M_functor._M_pod_data[0] = '\0';
    *(undefined8 *)((long)&(prVar16->content_check_).super__Function_base._M_functor + 8) = 0;
    *(undefined2 *)&(prVar16->content_check_).super__Function_base._M_manager = 0;
    *(undefined1 *)&(prVar16->content_check_)._M_invoker = 0;
    (prVar16->root_).super___shared_ptr<(anonymous_namespace)::schema,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::find<const_char_(&)[8],_0>((const_iterator *)&local_388,schema,(char (*) [8])"maximum");
    uStack_2fa = 0x8000;
    uStack_300 = 0;
    jStack_308.number_integer._7_1_ = 0;
    jStack_308.number_integer._5_2_ = 0;
    jStack_308.number_integer._4_1_ = 0;
    jStack_308.number_integer._0_4_ = 0;
    jStack_310 = (json_value)0x0;
    if (schema->m_type == array) {
      sVar4 = ((schema->m_value).string)->_M_string_length;
      jStack_308.number_integer._0_4_ = (undefined4)sVar4;
      jStack_308.number_integer._4_1_ = (undefined1)(sVar4 >> 0x20);
      jStack_308.number_integer._5_2_ = (undefined2)(sVar4 >> 0x28);
      jStack_308.number_integer._7_1_ = (undefined1)(sVar4 >> 0x38);
    }
    else if (schema->m_type == object) {
      jStack_310.object =
           (object_t *)&(((schema->m_value).object)->_M_t)._M_impl.super__Rb_tree_header;
    }
    else {
      uStack_300 = 1;
      uStack_2fa = 0;
    }
    uStack_2fb = 0;
    uStack_2fc = 0;
    uStack_2fd = 0;
    uStack_2fe = 0;
    local_318 = (json_value)schema;
    bVar15 = nlohmann::json_abi_v3_11_2::detail::
             iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ::
             operator==<nlohmann::json_abi_v3_11_2::detail::iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                       ((iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         *)&local_388,
                        (iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         *)&local_318);
    if (!bVar15) {
      pbVar17 = nlohmann::json_abi_v3_11_2::detail::
                iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::operator*((iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                             *)&local_388);
      local_318.object = (object_t *)0x0;
      nlohmann::json_abi_v3_11_2::detail::
      get_arithmetic_value<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_long,_0>
                (pbVar17,&local_318.number_integer);
      *(undefined1 *)&(prVar16->format_check_).super__Function_base._M_manager = 1;
      (prVar16->format_check_)._M_invoker = (_Invoker_type)local_318;
      jStack_308.number_integer._0_4_ = 0x6978616d;
      jStack_308.number_integer._4_1_ = 0x6d;
      jStack_308.number_integer._5_2_ = 0x6d75;
      jStack_310 = (json_value)0x7;
      jStack_308.number_integer._7_1_ = 0;
      local_318.object = (object_t *)&jStack_308;
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)kw,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_318);
      if (local_318.object != (object_t *)&jStack_308) {
        operator_delete(local_318.object,
                        CONCAT17(jStack_308.number_integer._7_1_,
                                 CONCAT25(jStack_308.number_integer._5_2_,
                                          CONCAT14(jStack_308.number_integer._4_1_,
                                                   jStack_308.number_integer._0_4_))) + 1);
      }
    }
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::find<const_char_(&)[8],_0>((const_iterator *)&local_318,schema,(char (*) [8])"minimum");
    local_378._M_allocated_capacity =
         CONCAT17(jStack_308.number_integer._7_1_,
                  CONCAT25(jStack_308.number_integer._5_2_,
                           CONCAT14(jStack_308.number_integer._4_1_,jStack_308.number_integer._0_4_)
                          ));
    local_378._8_8_ =
         CONCAT26(uStack_2fa,
                  CONCAT15(uStack_2fb,
                           CONCAT14(uStack_2fc,CONCAT13(uStack_2fd,CONCAT12(uStack_2fe,uStack_300)))
                          ));
    local_388.string = local_318.string;
    jStack_380.string = jStack_310.string;
    uStack_2fa = 0x8000;
    uStack_300 = 0;
    jStack_308.number_integer._7_1_ = 0;
    jStack_308.number_integer._5_2_ = 0;
    jStack_308.number_integer._4_1_ = 0;
    jStack_308.number_integer._0_4_ = 0;
    jStack_310 = (json_value)0x0;
    if (schema->m_type == array) {
      sVar4 = ((schema->m_value).string)->_M_string_length;
      jStack_308.number_integer._0_4_ = (undefined4)sVar4;
      jStack_308.number_integer._4_1_ = (undefined1)(sVar4 >> 0x20);
      jStack_308.number_integer._5_2_ = (undefined2)(sVar4 >> 0x28);
      jStack_308.number_integer._7_1_ = (undefined1)(sVar4 >> 0x38);
    }
    else if (schema->m_type == object) {
      jStack_310.object =
           (object_t *)&(((schema->m_value).object)->_M_t)._M_impl.super__Rb_tree_header;
    }
    else {
      uStack_300 = 1;
      uStack_2fa = 0;
    }
    uStack_2fb = 0;
    uStack_2fc = 0;
    uStack_2fd = 0;
    uStack_2fe = 0;
    local_318 = (json_value)schema;
    bVar15 = nlohmann::json_abi_v3_11_2::detail::
             iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ::
             operator==<nlohmann::json_abi_v3_11_2::detail::iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                       ((iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         *)&local_388,
                        (iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         *)&local_318);
    if (!bVar15) {
      pbVar17 = nlohmann::json_abi_v3_11_2::detail::
                iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::operator*((iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                             *)&local_388);
      local_318.object = (object_t *)0x0;
      nlohmann::json_abi_v3_11_2::detail::
      get_arithmetic_value<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_long,_0>
                (pbVar17,&local_318.number_integer);
      (prVar16->content_check_).super__Function_base._M_functor._M_pod_data[0] = '\x01';
      ((json_value *)((long)&(prVar16->content_check_).super__Function_base._M_functor + 8))->object
           = (object_t *)local_318;
      jStack_308.number_integer._0_4_ = 0x696e696d;
      jStack_308.number_integer._4_1_ = 0x6d;
      jStack_308.number_integer._5_2_ = 0x6d75;
      jStack_310 = (json_value)0x7;
      jStack_308.number_integer._7_1_ = 0;
      local_318.object = (object_t *)&jStack_308;
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)kw,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_318);
      if (local_318.object != (object_t *)&jStack_308) {
        operator_delete(local_318.object,
                        CONCAT17(jStack_308.number_integer._7_1_,
                                 CONCAT25(jStack_308.number_integer._5_2_,
                                          CONCAT14(jStack_308.number_integer._4_1_,
                                                   jStack_308.number_integer._0_4_))) + 1);
      }
    }
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::find<const_char_(&)[17],_0>
              ((const_iterator *)&local_318,schema,(char (*) [17])"exclusiveMaximum");
    local_378._M_allocated_capacity =
         CONCAT17(jStack_308.number_integer._7_1_,
                  CONCAT25(jStack_308.number_integer._5_2_,
                           CONCAT14(jStack_308.number_integer._4_1_,jStack_308.number_integer._0_4_)
                          ));
    local_378._8_8_ =
         CONCAT26(uStack_2fa,
                  CONCAT15(uStack_2fb,
                           CONCAT14(uStack_2fc,CONCAT13(uStack_2fd,CONCAT12(uStack_2fe,uStack_300)))
                          ));
    local_388.string = local_318.string;
    jStack_380.string = jStack_310.string;
    uStack_2fa = 0x8000;
    uStack_300 = 0;
    jStack_308.number_integer._7_1_ = 0;
    jStack_308.number_integer._5_2_ = 0;
    jStack_308.number_integer._4_1_ = 0;
    jStack_308.number_integer._0_4_ = 0;
    jStack_310.object = (object_t *)0x0;
    if (schema->m_type == array) {
      sVar4 = ((schema->m_value).string)->_M_string_length;
      jStack_308.number_integer._0_4_ = (undefined4)sVar4;
      jStack_308.number_integer._4_1_ = (undefined1)(sVar4 >> 0x20);
      jStack_308.number_integer._5_2_ = (undefined2)(sVar4 >> 0x28);
      jStack_308.number_integer._7_1_ = (undefined1)(sVar4 >> 0x38);
    }
    else if (schema->m_type == object) {
      jStack_310.object =
           (object_t *)&(((schema->m_value).object)->_M_t)._M_impl.super__Rb_tree_header;
    }
    else {
      uStack_300 = 1;
      uStack_2fa = 0;
    }
    uStack_2fb = 0;
    uStack_2fc = 0;
    uStack_2fd = 0;
    uStack_2fe = 0;
    local_318 = (json_value)schema;
    bVar15 = nlohmann::json_abi_v3_11_2::detail::
             iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ::
             operator==<nlohmann::json_abi_v3_11_2::detail::iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                       ((iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         *)&local_388,
                        (iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         *)&local_318);
    if (!bVar15) {
      *(undefined1 *)&(prVar16->content_check_).super__Function_base._M_manager = 1;
      pbVar17 = nlohmann::json_abi_v3_11_2::detail::
                iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::operator*((iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                             *)&local_388);
      local_318.object = (object_t *)0x0;
      nlohmann::json_abi_v3_11_2::detail::
      get_arithmetic_value<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_long,_0>
                (pbVar17,&local_318.number_integer);
      *(undefined1 *)&(prVar16->format_check_).super__Function_base._M_manager = 1;
      (prVar16->format_check_)._M_invoker = (_Invoker_type)local_318;
      local_198.number_integer = 0x10;
      local_318.object = (object_t *)&jStack_308;
      local_318.object =
           (object_t *)std::__cxx11::string::_M_create(&local_318.number_unsigned,(ulong)&local_198)
      ;
      jStack_308.number_integer._0_4_ = (undefined4)local_198.number_integer;
      jStack_308.number_integer._4_1_ = (undefined1)((ulong)local_198 >> 0x20);
      jStack_308.number_integer._5_2_ = (undefined2)((ulong)local_198 >> 0x28);
      jStack_308.number_integer._7_1_ = (undefined1)((ulong)local_198 >> 0x38);
      *(undefined8 *)
       &(local_318.array)->
        super__Vector_base<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
           = 0x766973756c637865;
      ((json_value *)
      &(local_318.array)->
       super__Vector_base<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
      )[1] = (json_value)0x6d756d6978614d65;
      jStack_310.string = local_198.string;
      (&((json_value *)&(local_318.object)->_M_t)->boolean)[local_198.number_integer] = false;
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)kw,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_318);
      if (local_318.object != (object_t *)&jStack_308) {
        operator_delete(local_318.object,
                        CONCAT17(jStack_308.number_integer._7_1_,
                                 CONCAT25(jStack_308.number_integer._5_2_,
                                          CONCAT14(jStack_308.number_integer._4_1_,
                                                   jStack_308.number_integer._0_4_))) + 1);
      }
    }
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::find<const_char_(&)[17],_0>
              ((const_iterator *)&local_318,schema,(char (*) [17])"exclusiveMinimum");
    local_378._M_allocated_capacity =
         CONCAT17(jStack_308.number_integer._7_1_,
                  CONCAT25(jStack_308.number_integer._5_2_,
                           CONCAT14(jStack_308.number_integer._4_1_,jStack_308.number_integer._0_4_)
                          ));
    local_378._8_8_ =
         CONCAT26(uStack_2fa,
                  CONCAT15(uStack_2fb,
                           CONCAT14(uStack_2fc,CONCAT13(uStack_2fd,CONCAT12(uStack_2fe,uStack_300)))
                          ));
    local_388.string = local_318.string;
    jStack_380.string = jStack_310.string;
    uStack_2fa = 0x8000;
    uStack_300 = 0;
    jStack_308.number_integer._7_1_ = 0;
    jStack_308.number_integer._5_2_ = 0;
    jStack_308.number_integer._4_1_ = 0;
    jStack_308.number_integer._0_4_ = 0;
    jStack_310.object = (object_t *)0x0;
    if (schema->m_type == array) {
      sVar4 = ((schema->m_value).string)->_M_string_length;
      jStack_308.number_integer._0_4_ = (undefined4)sVar4;
      jStack_308.number_integer._4_1_ = (undefined1)(sVar4 >> 0x20);
      jStack_308.number_integer._5_2_ = (undefined2)(sVar4 >> 0x28);
      jStack_308.number_integer._7_1_ = (undefined1)(sVar4 >> 0x38);
    }
    else if (schema->m_type == object) {
      jStack_310.object =
           (object_t *)&(((schema->m_value).object)->_M_t)._M_impl.super__Rb_tree_header;
    }
    else {
      uStack_300 = 1;
      uStack_2fa = 0;
    }
    uStack_2fb = 0;
    uStack_2fc = 0;
    uStack_2fd = 0;
    uStack_2fe = 0;
    local_318 = (json_value)schema;
    bVar15 = nlohmann::json_abi_v3_11_2::detail::
             iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ::
             operator==<nlohmann::json_abi_v3_11_2::detail::iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                       ((iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         *)&local_388,
                        (iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         *)&local_318);
    if (!bVar15) {
      *(undefined1 *)((long)&(prVar16->content_check_).super__Function_base._M_manager + 1) = 1;
      pbVar17 = nlohmann::json_abi_v3_11_2::detail::
                iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::operator*((iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                             *)&local_388);
      local_318.object = (object_t *)0x0;
      nlohmann::json_abi_v3_11_2::detail::
      get_arithmetic_value<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_long,_0>
                (pbVar17,&local_318.number_integer);
      (prVar16->content_check_).super__Function_base._M_functor._M_pod_data[0] = '\x01';
      ((json_value *)((long)&(prVar16->content_check_).super__Function_base._M_functor + 8))->object
           = (object_t *)local_318;
      local_198.number_integer = 0x10;
      local_318.object = (object_t *)&jStack_308;
      local_318.object =
           (object_t *)std::__cxx11::string::_M_create(&local_318.number_unsigned,(ulong)&local_198)
      ;
      jStack_308.number_integer._0_4_ = (undefined4)local_198.number_integer;
      jStack_308.number_integer._4_1_ = (undefined1)((ulong)local_198 >> 0x20);
      jStack_308.number_integer._5_2_ = (undefined2)((ulong)local_198 >> 0x28);
      jStack_308.number_integer._7_1_ = (undefined1)((ulong)local_198 >> 0x38);
      *(undefined8 *)
       &(local_318.array)->
        super__Vector_base<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
           = 0x766973756c637865;
      ((json_value *)
      &(local_318.array)->
       super__Vector_base<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
      )[1] = (json_value)0x6d756d696e694d65;
      jStack_310.string = local_198.string;
      (&((json_value *)&(local_318.object)->_M_t)->boolean)[local_198.number_integer] = false;
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)kw,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_318);
      if (local_318.object != (object_t *)&jStack_308) {
        operator_delete(local_318.object,
                        CONCAT17(jStack_308.number_integer._7_1_,
                                 CONCAT25(jStack_308.number_integer._5_2_,
                                          CONCAT14(jStack_308.number_integer._4_1_,
                                                   jStack_308.number_integer._0_4_))) + 1);
      }
    }
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::find<const_char_(&)[11],_0>((const_iterator *)&local_318,schema,(char (*) [11])"multipleOf");
    local_378._M_allocated_capacity =
         CONCAT17(jStack_308.number_integer._7_1_,
                  CONCAT25(jStack_308.number_integer._5_2_,
                           CONCAT14(jStack_308.number_integer._4_1_,jStack_308.number_integer._0_4_)
                          ));
    local_378._8_8_ =
         CONCAT26(uStack_2fa,
                  CONCAT15(uStack_2fb,
                           CONCAT14(uStack_2fc,CONCAT13(uStack_2fd,CONCAT12(uStack_2fe,uStack_300)))
                          ));
    local_388.string = local_318.string;
    jStack_380.string = jStack_310.string;
    uStack_2fa = 0x8000;
    uStack_300 = 0;
    jStack_308.number_integer._7_1_ = 0;
    jStack_308.number_integer._5_2_ = 0;
    jStack_308.number_integer._4_1_ = 0;
    jStack_308.number_integer._0_4_ = 0;
    jStack_310 = (json_value)0x0;
    if (schema->m_type == array) {
      sVar4 = ((schema->m_value).string)->_M_string_length;
      jStack_308.number_integer._0_4_ = (undefined4)sVar4;
      jStack_308.number_integer._4_1_ = (undefined1)(sVar4 >> 0x20);
      jStack_308.number_integer._5_2_ = (undefined2)(sVar4 >> 0x28);
      jStack_308.number_integer._7_1_ = (undefined1)(sVar4 >> 0x38);
    }
    else if (schema->m_type == object) {
      jStack_310.object =
           (object_t *)&(((schema->m_value).object)->_M_t)._M_impl.super__Rb_tree_header;
    }
    else {
      uStack_300 = 1;
      uStack_2fa = 0;
    }
    uStack_2fb = 0;
    uStack_2fc = 0;
    uStack_2fd = 0;
    uStack_2fe = 0;
    local_318 = (json_value)schema;
    bVar15 = nlohmann::json_abi_v3_11_2::detail::
             iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ::
             operator==<nlohmann::json_abi_v3_11_2::detail::iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                       ((iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         *)&local_388,
                        (iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         *)&local_318);
    if (!bVar15) {
      pbVar17 = nlohmann::json_abi_v3_11_2::detail::
                iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::operator*((iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                             *)&local_388);
      local_318.object = (object_t *)0x0;
      nlohmann::json_abi_v3_11_2::detail::
      get_arithmetic_value<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_double,_0>
                (pbVar17,&local_318.number_float);
      *(undefined1 *)&(prVar16->content_check_)._M_invoker = 1;
      (prVar16->root_).super___shared_ptr<(anonymous_namespace)::schema,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)local_318;
      jStack_308.number_integer._0_4_ = 0x746c756d;
      jStack_308.number_integer._4_1_ = 0x69;
      jStack_308.number_integer._5_2_ = 0x6c70;
      jStack_308.number_integer._7_1_ = 0x65;
      uStack_300 = 0x664f;
      jStack_310 = (json_value)0xa;
      uStack_2fe = 0;
      local_318.object = (object_t *)&jStack_308;
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)kw,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_318);
LAB_001204f0:
      if ((json_value *)local_318.object != &jStack_308) {
        operator_delete(local_318.object,
                        CONCAT17(jStack_308.number_integer._7_1_,
                                 CONCAT25(jStack_308.number_integer._5_2_,
                                          CONCAT14(jStack_308.number_integer._4_1_,
                                                   jStack_308.number_integer._0_4_))) + 1);
      }
    }
    goto LAB_0012050d;
  case 7:
    prVar16 = (root_schema *)operator_new(0x68);
    *(undefined8 *)((long)&(prVar16->loader_).super__Function_base._M_functor + 8) = 0x100000001;
    *(undefined ***)&(prVar16->loader_).super__Function_base._M_functor =
         &PTR___Sp_counted_ptr_inplace_0015a380;
    (prVar16->loader_)._M_invoker = (_Invoker_type)local_278;
    (prVar16->format_check_).super__Function_base._M_functor._M_pod_data[0] = '\0';
    *(undefined8 *)((long)&(prVar16->format_check_).super__Function_base._M_functor + 8) = 0;
    (prVar16->loader_).super__Function_base._M_manager =
         (_Manager_type)&PTR_make_for_default__0015a3d0;
    *(undefined1 *)&(prVar16->format_check_).super__Function_base._M_manager = 0;
    (prVar16->format_check_)._M_invoker = (_Invoker_type)0x0;
    (prVar16->content_check_).super__Function_base._M_functor._M_pod_data[0] = '\0';
    *(undefined8 *)((long)&(prVar16->content_check_).super__Function_base._M_functor + 8) = 0;
    *(undefined2 *)&(prVar16->content_check_).super__Function_base._M_manager = 0;
    *(undefined1 *)&(prVar16->content_check_)._M_invoker = 0;
    (prVar16->root_).super___shared_ptr<(anonymous_namespace)::schema,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::find<const_char_(&)[8],_0>((const_iterator *)&local_388,schema,(char (*) [8])"maximum");
    uStack_2fa = 0x8000;
    uStack_300 = 0;
    jStack_308.number_integer._7_1_ = 0;
    jStack_308.number_integer._5_2_ = 0;
    jStack_308.number_integer._4_1_ = 0;
    jStack_308.number_integer._0_4_ = 0;
    jStack_310 = (json_value)0x0;
    if (schema->m_type == array) {
      sVar4 = ((schema->m_value).string)->_M_string_length;
      jStack_308.number_integer._0_4_ = (undefined4)sVar4;
      jStack_308.number_integer._4_1_ = (undefined1)(sVar4 >> 0x20);
      jStack_308.number_integer._5_2_ = (undefined2)(sVar4 >> 0x28);
      jStack_308.number_integer._7_1_ = (undefined1)(sVar4 >> 0x38);
    }
    else if (schema->m_type == object) {
      jStack_310.object =
           (object_t *)&(((schema->m_value).object)->_M_t)._M_impl.super__Rb_tree_header;
    }
    else {
      uStack_300 = 1;
      uStack_2fa = 0;
    }
    uStack_2fb = 0;
    uStack_2fc = 0;
    uStack_2fd = 0;
    uStack_2fe = 0;
    local_318 = (json_value)schema;
    bVar15 = nlohmann::json_abi_v3_11_2::detail::
             iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ::
             operator==<nlohmann::json_abi_v3_11_2::detail::iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                       ((iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         *)&local_388,
                        (iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         *)&local_318);
    if (!bVar15) {
      pbVar17 = nlohmann::json_abi_v3_11_2::detail::
                iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::operator*((iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                             *)&local_388);
      local_318.object = (object_t *)0x0;
      nlohmann::json_abi_v3_11_2::detail::
      get_arithmetic_value<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_double,_0>
                (pbVar17,&local_318.number_float);
      *(undefined1 *)&(prVar16->format_check_).super__Function_base._M_manager = 1;
      (prVar16->format_check_)._M_invoker = (_Invoker_type)local_318;
      jStack_308.number_integer._0_4_ = 0x6978616d;
      jStack_308.number_integer._4_1_ = 0x6d;
      jStack_308.number_integer._5_2_ = 0x6d75;
      jStack_310 = (json_value)0x7;
      jStack_308.number_integer._7_1_ = 0;
      local_318.object = (object_t *)&jStack_308;
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)kw,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_318);
      if (local_318.object != (object_t *)&jStack_308) {
        operator_delete(local_318.object,
                        CONCAT17(jStack_308.number_integer._7_1_,
                                 CONCAT25(jStack_308.number_integer._5_2_,
                                          CONCAT14(jStack_308.number_integer._4_1_,
                                                   jStack_308.number_integer._0_4_))) + 1);
      }
    }
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::find<const_char_(&)[8],_0>((const_iterator *)&local_318,schema,(char (*) [8])"minimum");
    local_378._M_allocated_capacity =
         CONCAT17(jStack_308.number_integer._7_1_,
                  CONCAT25(jStack_308.number_integer._5_2_,
                           CONCAT14(jStack_308.number_integer._4_1_,jStack_308.number_integer._0_4_)
                          ));
    local_378._8_8_ =
         CONCAT26(uStack_2fa,
                  CONCAT15(uStack_2fb,
                           CONCAT14(uStack_2fc,CONCAT13(uStack_2fd,CONCAT12(uStack_2fe,uStack_300)))
                          ));
    local_388.string = local_318.string;
    jStack_380.string = jStack_310.string;
    uStack_2fa = 0x8000;
    uStack_300 = 0;
    jStack_308.number_integer._7_1_ = 0;
    jStack_308.number_integer._5_2_ = 0;
    jStack_308.number_integer._4_1_ = 0;
    jStack_308.number_integer._0_4_ = 0;
    jStack_310 = (json_value)0x0;
    if (schema->m_type == array) {
      sVar4 = ((schema->m_value).string)->_M_string_length;
      jStack_308.number_integer._0_4_ = (undefined4)sVar4;
      jStack_308.number_integer._4_1_ = (undefined1)(sVar4 >> 0x20);
      jStack_308.number_integer._5_2_ = (undefined2)(sVar4 >> 0x28);
      jStack_308.number_integer._7_1_ = (undefined1)(sVar4 >> 0x38);
    }
    else if (schema->m_type == object) {
      jStack_310.object =
           (object_t *)&(((schema->m_value).object)->_M_t)._M_impl.super__Rb_tree_header;
    }
    else {
      uStack_300 = 1;
      uStack_2fa = 0;
    }
    uStack_2fb = 0;
    uStack_2fc = 0;
    uStack_2fd = 0;
    uStack_2fe = 0;
    local_318 = (json_value)schema;
    bVar15 = nlohmann::json_abi_v3_11_2::detail::
             iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ::
             operator==<nlohmann::json_abi_v3_11_2::detail::iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                       ((iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         *)&local_388,
                        (iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         *)&local_318);
    if (!bVar15) {
      pbVar17 = nlohmann::json_abi_v3_11_2::detail::
                iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::operator*((iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                             *)&local_388);
      local_318.object = (object_t *)0x0;
      nlohmann::json_abi_v3_11_2::detail::
      get_arithmetic_value<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_double,_0>
                (pbVar17,&local_318.number_float);
      (prVar16->content_check_).super__Function_base._M_functor._M_pod_data[0] = '\x01';
      ((json_value *)((long)&(prVar16->content_check_).super__Function_base._M_functor + 8))->object
           = (object_t *)local_318;
      jStack_308.number_integer._0_4_ = 0x696e696d;
      jStack_308.number_integer._4_1_ = 0x6d;
      jStack_308.number_integer._5_2_ = 0x6d75;
      jStack_310 = (json_value)0x7;
      jStack_308.number_integer._7_1_ = 0;
      local_318.object = (object_t *)&jStack_308;
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)kw,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_318);
      if (local_318.object != (object_t *)&jStack_308) {
        operator_delete(local_318.object,
                        CONCAT17(jStack_308.number_integer._7_1_,
                                 CONCAT25(jStack_308.number_integer._5_2_,
                                          CONCAT14(jStack_308.number_integer._4_1_,
                                                   jStack_308.number_integer._0_4_))) + 1);
      }
    }
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::find<const_char_(&)[17],_0>
              ((const_iterator *)&local_318,schema,(char (*) [17])"exclusiveMaximum");
    local_378._M_allocated_capacity =
         CONCAT17(jStack_308.number_integer._7_1_,
                  CONCAT25(jStack_308.number_integer._5_2_,
                           CONCAT14(jStack_308.number_integer._4_1_,jStack_308.number_integer._0_4_)
                          ));
    local_378._8_8_ =
         CONCAT26(uStack_2fa,
                  CONCAT15(uStack_2fb,
                           CONCAT14(uStack_2fc,CONCAT13(uStack_2fd,CONCAT12(uStack_2fe,uStack_300)))
                          ));
    local_388.string = local_318.string;
    jStack_380.string = jStack_310.string;
    uStack_2fa = 0x8000;
    uStack_300 = 0;
    jStack_308.number_integer._7_1_ = 0;
    jStack_308.number_integer._5_2_ = 0;
    jStack_308.number_integer._4_1_ = 0;
    jStack_308.number_integer._0_4_ = 0;
    jStack_310.object = (object_t *)0x0;
    if (schema->m_type == array) {
      sVar4 = ((schema->m_value).string)->_M_string_length;
      jStack_308.number_integer._0_4_ = (undefined4)sVar4;
      jStack_308.number_integer._4_1_ = (undefined1)(sVar4 >> 0x20);
      jStack_308.number_integer._5_2_ = (undefined2)(sVar4 >> 0x28);
      jStack_308.number_integer._7_1_ = (undefined1)(sVar4 >> 0x38);
    }
    else if (schema->m_type == object) {
      jStack_310.object =
           (object_t *)&(((schema->m_value).object)->_M_t)._M_impl.super__Rb_tree_header;
    }
    else {
      uStack_300 = 1;
      uStack_2fa = 0;
    }
    uStack_2fb = 0;
    uStack_2fc = 0;
    uStack_2fd = 0;
    uStack_2fe = 0;
    local_318 = (json_value)schema;
    bVar15 = nlohmann::json_abi_v3_11_2::detail::
             iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ::
             operator==<nlohmann::json_abi_v3_11_2::detail::iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                       ((iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         *)&local_388,
                        (iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         *)&local_318);
    if (!bVar15) {
      *(undefined1 *)&(prVar16->content_check_).super__Function_base._M_manager = 1;
      pbVar17 = nlohmann::json_abi_v3_11_2::detail::
                iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::operator*((iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                             *)&local_388);
      local_318.object = (object_t *)0x0;
      nlohmann::json_abi_v3_11_2::detail::
      get_arithmetic_value<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_double,_0>
                (pbVar17,&local_318.number_float);
      *(undefined1 *)&(prVar16->format_check_).super__Function_base._M_manager = 1;
      (prVar16->format_check_)._M_invoker = (_Invoker_type)local_318;
      local_198.number_integer = 0x10;
      local_318.object = (object_t *)&jStack_308;
      local_318.object =
           (object_t *)std::__cxx11::string::_M_create(&local_318.number_unsigned,(ulong)&local_198)
      ;
      jStack_308.number_integer._0_4_ = (undefined4)local_198.number_integer;
      jStack_308.number_integer._4_1_ = (undefined1)((ulong)local_198 >> 0x20);
      jStack_308.number_integer._5_2_ = (undefined2)((ulong)local_198 >> 0x28);
      jStack_308.number_integer._7_1_ = (undefined1)((ulong)local_198 >> 0x38);
      *(undefined8 *)
       &(local_318.array)->
        super__Vector_base<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
           = 0x766973756c637865;
      ((json_value *)
      &(local_318.array)->
       super__Vector_base<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
      )[1] = (json_value)0x6d756d6978614d65;
      jStack_310.string = local_198.string;
      (&((json_value *)&(local_318.object)->_M_t)->boolean)[local_198.number_integer] = false;
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)kw,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_318);
      if (local_318.object != (object_t *)&jStack_308) {
        operator_delete(local_318.object,
                        CONCAT17(jStack_308.number_integer._7_1_,
                                 CONCAT25(jStack_308.number_integer._5_2_,
                                          CONCAT14(jStack_308.number_integer._4_1_,
                                                   jStack_308.number_integer._0_4_))) + 1);
      }
    }
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::find<const_char_(&)[17],_0>
              ((const_iterator *)&local_318,schema,(char (*) [17])"exclusiveMinimum");
    local_378._M_allocated_capacity =
         CONCAT17(jStack_308.number_integer._7_1_,
                  CONCAT25(jStack_308.number_integer._5_2_,
                           CONCAT14(jStack_308.number_integer._4_1_,jStack_308.number_integer._0_4_)
                          ));
    local_378._8_8_ =
         CONCAT26(uStack_2fa,
                  CONCAT15(uStack_2fb,
                           CONCAT14(uStack_2fc,CONCAT13(uStack_2fd,CONCAT12(uStack_2fe,uStack_300)))
                          ));
    local_388.string = local_318.string;
    jStack_380.string = jStack_310.string;
    uStack_2fa = 0x8000;
    uStack_300 = 0;
    jStack_308.number_integer._7_1_ = 0;
    jStack_308.number_integer._5_2_ = 0;
    jStack_308.number_integer._4_1_ = 0;
    jStack_308.number_integer._0_4_ = 0;
    jStack_310.object = (object_t *)0x0;
    if (schema->m_type == array) {
      sVar4 = ((schema->m_value).string)->_M_string_length;
      jStack_308.number_integer._0_4_ = (undefined4)sVar4;
      jStack_308.number_integer._4_1_ = (undefined1)(sVar4 >> 0x20);
      jStack_308.number_integer._5_2_ = (undefined2)(sVar4 >> 0x28);
      jStack_308.number_integer._7_1_ = (undefined1)(sVar4 >> 0x38);
    }
    else if (schema->m_type == object) {
      jStack_310.object =
           (object_t *)&(((schema->m_value).object)->_M_t)._M_impl.super__Rb_tree_header;
    }
    else {
      uStack_300 = 1;
      uStack_2fa = 0;
    }
    uStack_2fb = 0;
    uStack_2fc = 0;
    uStack_2fd = 0;
    uStack_2fe = 0;
    local_318 = (json_value)schema;
    bVar15 = nlohmann::json_abi_v3_11_2::detail::
             iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ::
             operator==<nlohmann::json_abi_v3_11_2::detail::iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                       ((iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         *)&local_388,
                        (iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         *)&local_318);
    if (!bVar15) {
      *(undefined1 *)((long)&(prVar16->content_check_).super__Function_base._M_manager + 1) = 1;
      pbVar17 = nlohmann::json_abi_v3_11_2::detail::
                iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::operator*((iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                             *)&local_388);
      local_318.object = (object_t *)0x0;
      nlohmann::json_abi_v3_11_2::detail::
      get_arithmetic_value<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_double,_0>
                (pbVar17,&local_318.number_float);
      (prVar16->content_check_).super__Function_base._M_functor._M_pod_data[0] = '\x01';
      ((json_value *)((long)&(prVar16->content_check_).super__Function_base._M_functor + 8))->object
           = (object_t *)local_318;
      local_198.number_integer = 0x10;
      local_318.object = (object_t *)&jStack_308;
      local_318.object =
           (object_t *)std::__cxx11::string::_M_create(&local_318.number_unsigned,(ulong)&local_198)
      ;
      jStack_308.number_integer._0_4_ = (undefined4)local_198.number_integer;
      jStack_308.number_integer._4_1_ = (undefined1)((ulong)local_198 >> 0x20);
      jStack_308.number_integer._5_2_ = (undefined2)((ulong)local_198 >> 0x28);
      jStack_308.number_integer._7_1_ = (undefined1)((ulong)local_198 >> 0x38);
      *(undefined8 *)
       &(local_318.array)->
        super__Vector_base<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
           = 0x766973756c637865;
      ((json_value *)
      &(local_318.array)->
       super__Vector_base<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
      )[1] = (json_value)0x6d756d696e694d65;
      jStack_310.string = local_198.string;
      (&((json_value *)&(local_318.object)->_M_t)->boolean)[local_198.number_integer] = false;
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)kw,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_318);
      if (local_318.object != (object_t *)&jStack_308) {
        operator_delete(local_318.object,
                        CONCAT17(jStack_308.number_integer._7_1_,
                                 CONCAT25(jStack_308.number_integer._5_2_,
                                          CONCAT14(jStack_308.number_integer._4_1_,
                                                   jStack_308.number_integer._0_4_))) + 1);
      }
    }
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::find<const_char_(&)[11],_0>((const_iterator *)&local_318,schema,(char (*) [11])"multipleOf");
    local_378._M_allocated_capacity =
         CONCAT17(jStack_308.number_integer._7_1_,
                  CONCAT25(jStack_308.number_integer._5_2_,
                           CONCAT14(jStack_308.number_integer._4_1_,jStack_308.number_integer._0_4_)
                          ));
    local_378._8_8_ =
         CONCAT26(uStack_2fa,
                  CONCAT15(uStack_2fb,
                           CONCAT14(uStack_2fc,CONCAT13(uStack_2fd,CONCAT12(uStack_2fe,uStack_300)))
                          ));
    local_388.string = local_318.string;
    jStack_380.string = jStack_310.string;
    uStack_2fa = 0x8000;
    uStack_300 = 0;
    jStack_308.number_integer._7_1_ = 0;
    jStack_308.number_integer._5_2_ = 0;
    jStack_308.number_integer._4_1_ = 0;
    jStack_308.number_integer._0_4_ = 0;
    jStack_310 = (json_value)0x0;
    if (schema->m_type == array) {
      sVar4 = ((schema->m_value).string)->_M_string_length;
      jStack_308.number_integer._0_4_ = (undefined4)sVar4;
      jStack_308.number_integer._4_1_ = (undefined1)(sVar4 >> 0x20);
      jStack_308.number_integer._5_2_ = (undefined2)(sVar4 >> 0x28);
      jStack_308.number_integer._7_1_ = (undefined1)(sVar4 >> 0x38);
    }
    else if (schema->m_type == object) {
      jStack_310.object =
           (object_t *)&(((schema->m_value).object)->_M_t)._M_impl.super__Rb_tree_header;
    }
    else {
      uStack_300 = 1;
      uStack_2fa = 0;
    }
    uStack_2fb = 0;
    uStack_2fc = 0;
    uStack_2fd = 0;
    uStack_2fe = 0;
    local_318 = (json_value)schema;
    bVar15 = nlohmann::json_abi_v3_11_2::detail::
             iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ::
             operator==<nlohmann::json_abi_v3_11_2::detail::iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                       ((iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         *)&local_388,
                        (iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         *)&local_318);
    if (!bVar15) {
      pbVar17 = nlohmann::json_abi_v3_11_2::detail::
                iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::operator*((iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                             *)&local_388);
      local_318.object = (object_t *)0x0;
      nlohmann::json_abi_v3_11_2::detail::
      get_arithmetic_value<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_double,_0>
                (pbVar17,&local_318.number_float);
      *(undefined1 *)&(prVar16->content_check_)._M_invoker = 1;
      (prVar16->root_).super___shared_ptr<(anonymous_namespace)::schema,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)local_318;
      jStack_308.number_integer._0_4_ = 0x746c756d;
      jStack_308.number_integer._4_1_ = 0x69;
      jStack_308.number_integer._5_2_ = 0x6c70;
      jStack_308.number_integer._7_1_ = 0x65;
      uStack_300 = 0x664f;
      jStack_310 = (json_value)0xa;
      uStack_2fe = 0;
      local_318.object = (object_t *)&jStack_308;
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)kw,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_318);
      goto LAB_001204f0;
    }
LAB_0012050d:
    (local_238->super_schema)._vptr_schema =
         (_func_int **)&(prVar16->loader_).super__Function_base._M_manager;
    this = local_238;
LAB_001218b7:
    (this->super_schema).root_ = prVar16;
    _Var31._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
    goto LAB_00121fe5;
  default:
    (this->super_schema)._vptr_schema = (_func_int **)0x0;
    (this->super_schema).root_ = (root_schema *)0x0;
    _Var31._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   CONCAT71(in_register_00000011,type);
    goto LAB_00121fe5;
  }
  (this->super_schema).root_ = local_270;
  _Var31._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
LAB_00121fe5:
  sVar40.super___shared_ptr<(anonymous_namespace)::schema,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var31._M_pi;
  sVar40.super___shared_ptr<(anonymous_namespace)::schema,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &this->super_schema;
  return (shared_ptr<(anonymous_namespace)::schema>)
         sVar40.super___shared_ptr<(anonymous_namespace)::schema,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<schema> type_schema::make(json &schema,
                                          json::value_t type,
                                          root_schema *root,
                                          const std::vector<nlohmann::json_uri> &uris,
                                          std::set<std::string> &kw)
{
	switch (type) {
	case json::value_t::null:
		return std::make_shared<null>(schema, root);

	case json::value_t::number_unsigned:
	case json::value_t::number_integer:
		return std::make_shared<numeric<json::number_integer_t>>(schema, root, kw);
	case json::value_t::number_float:
		return std::make_shared<numeric<json::number_float_t>>(schema, root, kw);
	case json::value_t::string:
		return std::make_shared<string>(schema, root);
	case json::value_t::boolean:
		return std::make_shared<boolean_type>(schema, root);
	case json::value_t::object:
		return std::make_shared<object>(schema, root, uris);
	case json::value_t::array:
		return std::make_shared<array>(schema, root, uris);

	case json::value_t::discarded: // not a real type - silence please
		break;

	case json::value_t::binary:
		break;
	}
	return nullptr;
}